

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O0

void rgb24_yuv420_sseu(uint32_t width,uint32_t height,uint8_t *RGB,uint32_t RGB_stride,uint8_t *Y,
                      uint8_t *U,uint8_t *V,uint32_t Y_stride,uint32_t UV_stride,YCbCrType yuv_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  RGB2YUVParam *pRVar23;
  ulong uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar61 [16];
  __m128i rgb6;
  __m128i rgb5;
  __m128i rgb4;
  __m128i rgb3;
  __m128i rgb2;
  __m128i rgb1;
  __m128i tmp6;
  __m128i tmp5;
  __m128i tmp4;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i cr;
  __m128i cb;
  __m128i Y_1;
  __m128i cr2_16;
  __m128i cr1_16;
  __m128i cb2_16;
  __m128i cb1_16;
  __m128i y2_16;
  __m128i y1_16;
  __m128i b_16;
  __m128i g_16;
  __m128i r_16;
  uint8_t *local_2230;
  uint8_t *v_ptr;
  uint8_t *u_ptr;
  uint8_t *y_ptr2;
  uint8_t *y_ptr1;
  uint8_t *rgb_ptr2;
  uint8_t *rgb_ptr1;
  uint32_t y;
  uint32_t x;
  RGB2YUVParam *param;
  uint8_t *U_local;
  uint8_t *Y_local;
  uint32_t RGB_stride_local;
  uint8_t *RGB_local;
  uint32_t height_local;
  uint32_t width_local;
  byte local_1fe8;
  byte bStack_1fe7;
  byte bStack_1fe6;
  byte bStack_1fe5;
  byte bStack_1fe4;
  byte bStack_1fe3;
  byte bStack_1fe2;
  byte bStack_1fe1;
  byte local_1fd8;
  byte bStack_1fd7;
  byte bStack_1fd6;
  byte bStack_1fd5;
  byte bStack_1fd4;
  byte bStack_1fd3;
  byte bStack_1fd2;
  byte bStack_1fd1;
  byte local_1fc8;
  byte bStack_1fc7;
  byte bStack_1fc6;
  byte bStack_1fc5;
  byte bStack_1fc4;
  byte bStack_1fc3;
  byte bStack_1fc2;
  byte bStack_1fc1;
  byte local_1fb8;
  byte bStack_1fb7;
  byte bStack_1fb6;
  byte bStack_1fb5;
  byte bStack_1fb4;
  byte bStack_1fb3;
  byte bStack_1fb2;
  byte bStack_1fb1;
  byte local_1fa8;
  byte bStack_1fa7;
  byte bStack_1fa6;
  byte bStack_1fa5;
  byte bStack_1fa4;
  byte bStack_1fa3;
  byte bStack_1fa2;
  byte bStack_1fa1;
  byte local_1f98;
  byte bStack_1f97;
  byte bStack_1f96;
  byte bStack_1f95;
  byte bStack_1f94;
  byte bStack_1f93;
  byte bStack_1f92;
  byte bStack_1f91;
  byte local_1da8;
  byte bStack_1da7;
  byte bStack_1da6;
  byte bStack_1da5;
  byte bStack_1da4;
  byte bStack_1da3;
  byte bStack_1da2;
  byte bStack_1da1;
  byte local_1d98;
  byte bStack_1d97;
  byte bStack_1d96;
  byte bStack_1d95;
  byte bStack_1d94;
  byte bStack_1d93;
  byte bStack_1d92;
  byte bStack_1d91;
  byte local_1d88;
  byte bStack_1d87;
  byte bStack_1d86;
  byte bStack_1d85;
  byte bStack_1d84;
  byte bStack_1d83;
  byte bStack_1d82;
  byte bStack_1d81;
  byte local_1d78;
  byte bStack_1d77;
  byte bStack_1d76;
  byte bStack_1d75;
  byte bStack_1d74;
  byte bStack_1d73;
  byte bStack_1d72;
  byte bStack_1d71;
  byte local_1d68;
  byte bStack_1d67;
  byte bStack_1d66;
  byte bStack_1d65;
  byte bStack_1d64;
  byte bStack_1d63;
  byte bStack_1d62;
  byte bStack_1d61;
  byte local_1d58;
  byte bStack_1d57;
  byte bStack_1d56;
  byte bStack_1d55;
  byte bStack_1d54;
  byte bStack_1d53;
  byte bStack_1d52;
  byte bStack_1d51;
  byte bStack_1b20;
  byte bStack_1b1f;
  byte bStack_1b1e;
  byte bStack_1b1d;
  byte bStack_1b1c;
  byte bStack_1b1b;
  byte bStack_1b1a;
  byte bStack_1b19;
  byte bStack_1b10;
  byte bStack_1b0f;
  byte bStack_1b0e;
  byte bStack_1b0d;
  byte bStack_1b0c;
  byte bStack_1b0b;
  byte bStack_1b0a;
  byte bStack_1b09;
  byte bStack_1b00;
  byte bStack_1aff;
  byte bStack_1afe;
  byte bStack_1afd;
  byte bStack_1afc;
  byte bStack_1afb;
  byte bStack_1afa;
  byte bStack_1af9;
  byte bStack_1af0;
  byte bStack_1aef;
  byte bStack_1aee;
  byte bStack_1aed;
  byte bStack_1aec;
  byte bStack_1aeb;
  byte bStack_1aea;
  byte bStack_1ae9;
  byte bStack_1ae0;
  byte bStack_1adf;
  byte bStack_1ade;
  byte bStack_1add;
  byte bStack_1adc;
  byte bStack_1adb;
  byte bStack_1ada;
  byte bStack_1ad9;
  byte bStack_1ad0;
  byte bStack_1acf;
  byte bStack_1ace;
  byte bStack_1acd;
  byte bStack_1acc;
  byte bStack_1acb;
  byte bStack_1aca;
  byte bStack_1ac9;
  byte bStack_18a0;
  byte bStack_189f;
  byte bStack_189e;
  byte bStack_189d;
  byte bStack_189c;
  byte bStack_189b;
  byte bStack_189a;
  byte bStack_1899;
  byte bStack_1890;
  byte bStack_188f;
  byte bStack_188e;
  byte bStack_188d;
  byte bStack_188c;
  byte bStack_188b;
  byte bStack_188a;
  byte bStack_1889;
  byte bStack_1880;
  byte bStack_187f;
  byte bStack_187e;
  byte bStack_187d;
  byte bStack_187c;
  byte bStack_187b;
  byte bStack_187a;
  byte bStack_1879;
  byte bStack_1870;
  byte bStack_186f;
  byte bStack_186e;
  byte bStack_186d;
  byte bStack_186c;
  byte bStack_186b;
  byte bStack_186a;
  byte bStack_1869;
  byte bStack_1860;
  byte bStack_185f;
  byte bStack_185e;
  byte bStack_185d;
  byte bStack_185c;
  byte bStack_185b;
  byte bStack_185a;
  byte bStack_1859;
  byte bStack_1850;
  byte bStack_184f;
  byte bStack_184e;
  byte bStack_184d;
  byte bStack_184c;
  byte bStack_184b;
  byte bStack_184a;
  byte bStack_1849;
  short local_16b8;
  short sStack_16b6;
  short sStack_16b4;
  short sStack_16b2;
  short sStack_16b0;
  short sStack_16ae;
  short sStack_16ac;
  short sStack_16aa;
  short local_1698;
  short sStack_1696;
  short sStack_1694;
  short sStack_1692;
  short sStack_1690;
  short sStack_168e;
  short sStack_168c;
  short sStack_168a;
  ushort uStack_1686;
  ushort uStack_1684;
  ushort uStack_1682;
  ushort uStack_167e;
  ushort uStack_167c;
  ushort uStack_167a;
  ushort uStack_1666;
  ushort uStack_1664;
  ushort uStack_1662;
  ushort uStack_165e;
  ushort uStack_165c;
  ushort uStack_165a;
  ushort uStack_1546;
  ushort uStack_1544;
  ushort uStack_1542;
  ushort uStack_153e;
  ushort uStack_153c;
  ushort uStack_153a;
  ushort uStack_1526;
  ushort uStack_1524;
  ushort uStack_1522;
  ushort uStack_151e;
  ushort uStack_151c;
  ushort uStack_151a;
  short local_1438;
  short sStack_1436;
  short sStack_1434;
  short sStack_1432;
  short sStack_1430;
  short sStack_142e;
  short sStack_142c;
  short sStack_142a;
  short local_1418;
  short sStack_1416;
  short sStack_1414;
  short sStack_1412;
  short sStack_1410;
  short sStack_140e;
  short sStack_140c;
  short sStack_140a;
  ushort uStack_1406;
  ushort uStack_1404;
  ushort uStack_1402;
  ushort uStack_13fe;
  ushort uStack_13fc;
  ushort uStack_13fa;
  ushort uStack_13e6;
  ushort uStack_13e4;
  ushort uStack_13e2;
  ushort uStack_13de;
  ushort uStack_13dc;
  ushort uStack_13da;
  ushort uStack_12c6;
  ushort uStack_12c4;
  ushort uStack_12c2;
  ushort uStack_12be;
  ushort uStack_12bc;
  ushort uStack_12ba;
  ushort uStack_12a6;
  ushort uStack_12a4;
  ushort uStack_12a2;
  ushort uStack_129e;
  ushort uStack_129c;
  ushort uStack_129a;
  ushort uStack_11c6;
  ushort uStack_11c4;
  ushort uStack_11c2;
  ushort uStack_11be;
  ushort uStack_11bc;
  ushort uStack_11ba;
  short local_11b8;
  short sStack_11b6;
  short sStack_11b4;
  short sStack_11b2;
  short sStack_11b0;
  short sStack_11ae;
  short sStack_11ac;
  short sStack_11aa;
  ushort uStack_11a6;
  ushort uStack_11a4;
  ushort uStack_11a2;
  ushort uStack_119e;
  ushort uStack_119c;
  ushort uStack_119a;
  short local_1198;
  short sStack_1196;
  short sStack_1194;
  short sStack_1192;
  short sStack_1190;
  short sStack_118e;
  short sStack_118c;
  short sStack_118a;
  ushort uStack_1186;
  ushort uStack_1184;
  ushort uStack_1182;
  ushort uStack_117e;
  ushort uStack_117c;
  ushort uStack_117a;
  ushort uStack_1166;
  ushort uStack_1164;
  ushort uStack_1162;
  ushort uStack_115e;
  ushort uStack_115c;
  ushort uStack_115a;
  ushort uStack_1146;
  ushort uStack_1144;
  ushort uStack_1142;
  ushort uStack_113e;
  ushort uStack_113c;
  ushort uStack_113a;
  ushort uStack_1136;
  ushort uStack_1134;
  ushort uStack_1132;
  ushort uStack_112e;
  ushort uStack_112c;
  ushort uStack_112a;
  ushort uStack_1126;
  ushort uStack_1124;
  ushort uStack_1122;
  ushort uStack_111e;
  ushort uStack_111c;
  ushort uStack_111a;
  ushort uStack_1116;
  ushort uStack_1114;
  ushort uStack_1112;
  ushort uStack_110e;
  ushort uStack_110c;
  ushort uStack_110a;
  ushort uStack_1106;
  ushort uStack_1104;
  ushort uStack_1102;
  ushort uStack_10fe;
  ushort uStack_10fc;
  ushort uStack_10fa;
  ushort uStack_10f6;
  ushort uStack_10f4;
  ushort uStack_10f2;
  ushort uStack_10ee;
  ushort uStack_10ec;
  ushort uStack_10ea;
  ushort uStack_10e6;
  ushort uStack_10e4;
  ushort uStack_10e2;
  ushort uStack_10de;
  ushort uStack_10dc;
  ushort uStack_10da;
  ushort uStack_10d6;
  ushort uStack_10d4;
  ushort uStack_10d2;
  ushort uStack_10ce;
  ushort uStack_10cc;
  ushort uStack_10ca;
  ushort uStack_10c6;
  ushort uStack_10c4;
  ushort uStack_10c2;
  ushort uStack_10be;
  ushort uStack_10bc;
  ushort uStack_10ba;
  ushort uStack_10b6;
  ushort uStack_10b4;
  ushort uStack_10b2;
  ushort uStack_10ae;
  ushort uStack_10ac;
  ushort uStack_10aa;
  ushort uStack_10a6;
  ushort uStack_10a4;
  ushort uStack_10a2;
  ushort uStack_109e;
  ushort uStack_109c;
  ushort uStack_109a;
  ushort uStack_1096;
  ushort uStack_1094;
  ushort uStack_1092;
  ushort uStack_108e;
  ushort uStack_108c;
  ushort uStack_108a;
  ushort uStack_1086;
  ushort uStack_1084;
  ushort uStack_1082;
  ushort uStack_107e;
  ushort uStack_107c;
  ushort uStack_107a;
  ushort uStack_1066;
  ushort uStack_1064;
  ushort uStack_1062;
  ushort uStack_105e;
  ushort uStack_105c;
  ushort uStack_105a;
  ushort uStack_1046;
  ushort uStack_1044;
  ushort uStack_1042;
  ushort uStack_103e;
  ushort uStack_103c;
  ushort uStack_103a;
  ushort uStack_1036;
  ushort uStack_1034;
  ushort uStack_1032;
  ushort uStack_102e;
  ushort uStack_102c;
  ushort uStack_102a;
  ushort uStack_1026;
  ushort uStack_1024;
  ushort uStack_1022;
  ushort uStack_101e;
  ushort uStack_101c;
  ushort uStack_101a;
  ushort uStack_1016;
  ushort uStack_1014;
  ushort uStack_1012;
  ushort uStack_100e;
  ushort uStack_100c;
  ushort uStack_100a;
  ushort uStack_1006;
  ushort uStack_1004;
  ushort uStack_1002;
  ushort uStack_ffe;
  ushort uStack_ffc;
  ushort uStack_ffa;
  ushort uStack_ff6;
  ushort uStack_ff4;
  ushort uStack_ff2;
  ushort uStack_fee;
  ushort uStack_fec;
  ushort uStack_fea;
  ushort uStack_fe6;
  ushort uStack_fe4;
  ushort uStack_fe2;
  ushort uStack_fde;
  ushort uStack_fdc;
  ushort uStack_fda;
  ushort uStack_fd6;
  ushort uStack_fd4;
  ushort uStack_fd2;
  ushort uStack_fce;
  ushort uStack_fcc;
  ushort uStack_fca;
  ushort uStack_fc6;
  ushort uStack_fc4;
  ushort uStack_fc2;
  ushort uStack_fbe;
  ushort uStack_fbc;
  ushort uStack_fba;
  ushort uStack_fb6;
  ushort uStack_fb4;
  ushort uStack_fb2;
  ushort uStack_fae;
  ushort uStack_fac;
  ushort uStack_faa;
  ushort uStack_fa6;
  ushort uStack_fa4;
  ushort uStack_fa2;
  ushort uStack_f9e;
  ushort uStack_f9c;
  ushort uStack_f9a;
  ushort uStack_f96;
  ushort uStack_f94;
  ushort uStack_f92;
  ushort uStack_f8e;
  ushort uStack_f8c;
  ushort uStack_f8a;
  ushort uStack_f86;
  ushort uStack_f84;
  ushort uStack_f82;
  ushort uStack_f7e;
  ushort uStack_f7c;
  ushort uStack_f7a;
  short local_f78;
  short sStack_f76;
  short sStack_f74;
  short sStack_f72;
  short sStack_f70;
  short sStack_f6e;
  short sStack_f6c;
  short sStack_f6a;
  ushort uStack_f66;
  ushort uStack_f64;
  ushort uStack_f62;
  ushort uStack_f5e;
  ushort uStack_f5c;
  ushort uStack_f5a;
  short local_f58;
  short sStack_f56;
  short sStack_f54;
  short sStack_f52;
  short sStack_f50;
  short sStack_f4e;
  short sStack_f4c;
  short sStack_f4a;
  ushort uStack_f46;
  ushort uStack_f44;
  ushort uStack_f42;
  ushort uStack_f3e;
  ushort uStack_f3c;
  ushort uStack_f3a;
  ushort uStack_f26;
  ushort uStack_f24;
  ushort uStack_f22;
  ushort uStack_f1e;
  ushort uStack_f1c;
  ushort uStack_f1a;
  ushort uStack_f06;
  ushort uStack_f04;
  ushort uStack_f02;
  ushort uStack_efe;
  ushort uStack_efc;
  ushort uStack_efa;
  ushort uStack_ef6;
  ushort uStack_ef4;
  ushort uStack_ef2;
  ushort uStack_eee;
  ushort uStack_eec;
  ushort uStack_eea;
  ushort uStack_ee6;
  ushort uStack_ee4;
  ushort uStack_ee2;
  ushort uStack_ede;
  ushort uStack_edc;
  ushort uStack_eda;
  ushort uStack_ed6;
  ushort uStack_ed4;
  ushort uStack_ed2;
  ushort uStack_ece;
  ushort uStack_ecc;
  ushort uStack_eca;
  ushort uStack_ec6;
  ushort uStack_ec4;
  ushort uStack_ec2;
  ushort uStack_ebe;
  ushort uStack_ebc;
  ushort uStack_eba;
  ushort uStack_eb6;
  ushort uStack_eb4;
  ushort uStack_eb2;
  ushort uStack_eae;
  ushort uStack_eac;
  ushort uStack_eaa;
  ushort uStack_ea6;
  ushort uStack_ea4;
  ushort uStack_ea2;
  ushort uStack_e9e;
  ushort uStack_e9c;
  ushort uStack_e9a;
  ushort uStack_e96;
  ushort uStack_e94;
  ushort uStack_e92;
  ushort uStack_e8e;
  ushort uStack_e8c;
  ushort uStack_e8a;
  ushort uStack_e86;
  ushort uStack_e84;
  ushort uStack_e82;
  ushort uStack_e7e;
  ushort uStack_e7c;
  ushort uStack_e7a;
  ushort uStack_e76;
  ushort uStack_e74;
  ushort uStack_e72;
  ushort uStack_e6e;
  ushort uStack_e6c;
  ushort uStack_e6a;
  ushort uStack_e66;
  ushort uStack_e64;
  ushort uStack_e62;
  ushort uStack_e5e;
  ushort uStack_e5c;
  ushort uStack_e5a;
  ushort uStack_e56;
  ushort uStack_e54;
  ushort uStack_e52;
  ushort uStack_e4e;
  ushort uStack_e4c;
  ushort uStack_e4a;
  ushort uStack_e46;
  ushort uStack_e44;
  ushort uStack_e42;
  ushort uStack_e3e;
  ushort uStack_e3c;
  ushort uStack_e3a;
  ushort uStack_e26;
  ushort uStack_e24;
  ushort uStack_e22;
  ushort uStack_e1e;
  ushort uStack_e1c;
  ushort uStack_e1a;
  ushort uStack_e06;
  ushort uStack_e04;
  ushort uStack_e02;
  ushort uStack_dfe;
  ushort uStack_dfc;
  ushort uStack_dfa;
  ushort uStack_df6;
  ushort uStack_df4;
  ushort uStack_df2;
  ushort uStack_dee;
  ushort uStack_dec;
  ushort uStack_dea;
  ushort uStack_de6;
  ushort uStack_de4;
  ushort uStack_de2;
  ushort uStack_dde;
  ushort uStack_ddc;
  ushort uStack_dda;
  ushort uStack_dd6;
  ushort uStack_dd4;
  ushort uStack_dd2;
  ushort uStack_dce;
  ushort uStack_dcc;
  ushort uStack_dca;
  ushort uStack_dc6;
  ushort uStack_dc4;
  ushort uStack_dc2;
  ushort uStack_dbe;
  ushort uStack_dbc;
  ushort uStack_dba;
  ushort uStack_db6;
  ushort uStack_db4;
  ushort uStack_db2;
  ushort uStack_dae;
  ushort uStack_dac;
  ushort uStack_daa;
  ushort uStack_da6;
  ushort uStack_da4;
  ushort uStack_da2;
  ushort uStack_d9e;
  ushort uStack_d9c;
  ushort uStack_d9a;
  ushort uStack_d96;
  ushort uStack_d94;
  ushort uStack_d92;
  ushort uStack_d8e;
  ushort uStack_d8c;
  ushort uStack_d8a;
  ushort uStack_d86;
  ushort uStack_d84;
  ushort uStack_d82;
  ushort uStack_d7e;
  ushort uStack_d7c;
  ushort uStack_d7a;
  ushort uStack_d76;
  ushort uStack_d74;
  ushort uStack_d72;
  ushort uStack_d6e;
  ushort uStack_d6c;
  ushort uStack_d6a;
  ushort uStack_d66;
  ushort uStack_d64;
  ushort uStack_d62;
  ushort uStack_d5e;
  ushort uStack_d5c;
  ushort uStack_d5a;
  ushort uStack_d56;
  ushort uStack_d54;
  ushort uStack_d52;
  ushort uStack_d4e;
  ushort uStack_d4c;
  ushort uStack_d4a;
  ushort uStack_ad6;
  ushort uStack_ad4;
  ushort uStack_ad2;
  ushort uStack_ace;
  ushort uStack_acc;
  ushort uStack_aca;
  ushort uStack_ab6;
  ushort uStack_ab4;
  ushort uStack_ab2;
  ushort uStack_aae;
  ushort uStack_aac;
  ushort uStack_aaa;
  ushort uStack_a96;
  ushort uStack_a94;
  ushort uStack_a92;
  ushort uStack_a8e;
  ushort uStack_a8c;
  ushort uStack_a8a;
  ushort uStack_a76;
  ushort uStack_a74;
  ushort uStack_a72;
  ushort uStack_a6e;
  ushort uStack_a6c;
  ushort uStack_a6a;
  ushort uStack_a56;
  ushort uStack_a54;
  ushort uStack_a52;
  ushort uStack_a4e;
  ushort uStack_a4c;
  ushort uStack_a4a;
  ushort uStack_a36;
  ushort uStack_a34;
  ushort uStack_a32;
  ushort uStack_a2e;
  ushort uStack_a2c;
  ushort uStack_a2a;
  ushort uStack_a16;
  ushort uStack_a14;
  ushort uStack_a12;
  ushort uStack_a0e;
  ushort uStack_a0c;
  ushort uStack_a0a;
  ushort uStack_9f6;
  ushort uStack_9f4;
  ushort uStack_9f2;
  ushort uStack_9ee;
  ushort uStack_9ec;
  ushort uStack_9ea;
  ushort uStack_9d6;
  ushort uStack_9d4;
  ushort uStack_9d2;
  ushort uStack_9ce;
  ushort uStack_9cc;
  ushort uStack_9ca;
  ushort uStack_9b6;
  ushort uStack_9b4;
  ushort uStack_9b2;
  ushort uStack_9ae;
  ushort uStack_9ac;
  ushort uStack_9aa;
  ushort uStack_996;
  ushort uStack_994;
  ushort uStack_992;
  ushort uStack_98e;
  ushort uStack_98c;
  ushort uStack_98a;
  ushort uStack_976;
  ushort uStack_974;
  ushort uStack_972;
  ushort uStack_96e;
  ushort uStack_96c;
  ushort uStack_96a;
  ushort uStack_956;
  ushort uStack_954;
  ushort uStack_952;
  ushort uStack_94e;
  ushort uStack_94c;
  ushort uStack_94a;
  ushort uStack_936;
  ushort uStack_934;
  ushort uStack_932;
  ushort uStack_92e;
  ushort uStack_92c;
  ushort uStack_92a;
  ushort uStack_916;
  ushort uStack_914;
  ushort uStack_912;
  ushort uStack_90e;
  ushort uStack_90c;
  ushort uStack_90a;
  ushort uStack_8f6;
  ushort uStack_8f4;
  ushort uStack_8f2;
  ushort uStack_8ee;
  ushort uStack_8ec;
  ushort uStack_8ea;
  
  uVar24 = (ulong)yuv_type;
  pRVar23 = RGB2YUV + uVar24;
  for (rgb_ptr1._0_4_ = 0; (uint)rgb_ptr1 < height - 1; rgb_ptr1._0_4_ = (uint)rgb_ptr1 + 2) {
    rgb_ptr2 = RGB + (uint)rgb_ptr1 * RGB_stride;
    y_ptr1 = RGB + ((uint)rgb_ptr1 + 1) * RGB_stride;
    y_ptr2 = Y + (uint)rgb_ptr1 * Y_stride;
    u_ptr = Y + ((uint)rgb_ptr1 + 1) * Y_stride;
    v_ptr = U + ((uint)rgb_ptr1 >> 1) * UV_stride;
    local_2230 = V + ((uint)rgb_ptr1 >> 1) * UV_stride;
    for (rgb_ptr1._4_4_ = 0; rgb_ptr1._4_4_ < width - 0x1f; rgb_ptr1._4_4_ = rgb_ptr1._4_4_ + 0x20)
    {
      uVar4 = *(undefined8 *)rgb_ptr2;
      uVar5 = *(undefined8 *)(rgb_ptr2 + 8);
      uVar6 = *(undefined8 *)(rgb_ptr2 + 0x10);
      uVar7 = *(undefined8 *)(rgb_ptr2 + 0x18);
      uVar8 = *(undefined8 *)(rgb_ptr2 + 0x20);
      uVar9 = *(undefined8 *)(rgb_ptr2 + 0x28);
      uVar10 = *(undefined8 *)y_ptr1;
      uVar11 = *(undefined8 *)(y_ptr1 + 8);
      uVar12 = *(undefined8 *)(y_ptr1 + 0x10);
      uVar13 = *(undefined8 *)(y_ptr1 + 0x18);
      uVar14 = *(undefined8 *)(y_ptr1 + 0x20);
      uVar15 = *(undefined8 *)(y_ptr1 + 0x28);
      local_1d58 = (byte)uVar4;
      bStack_1d57 = (byte)((ulong)uVar4 >> 8);
      bStack_1d56 = (byte)((ulong)uVar4 >> 0x10);
      bStack_1d55 = (byte)((ulong)uVar4 >> 0x18);
      bStack_1d54 = (byte)((ulong)uVar4 >> 0x20);
      bStack_1d53 = (byte)((ulong)uVar4 >> 0x28);
      bStack_1d52 = (byte)((ulong)uVar4 >> 0x30);
      bStack_1d51 = (byte)((ulong)uVar4 >> 0x38);
      local_1d68 = (byte)uVar10;
      bStack_1d67 = (byte)((ulong)uVar10 >> 8);
      bStack_1d66 = (byte)((ulong)uVar10 >> 0x10);
      bStack_1d65 = (byte)((ulong)uVar10 >> 0x18);
      bStack_1d64 = (byte)((ulong)uVar10 >> 0x20);
      bStack_1d63 = (byte)((ulong)uVar10 >> 0x28);
      bStack_1d62 = (byte)((ulong)uVar10 >> 0x30);
      bStack_1d61 = (byte)((ulong)uVar10 >> 0x38);
      bStack_1850 = (byte)uVar5;
      bStack_184f = (byte)((ulong)uVar5 >> 8);
      bStack_184e = (byte)((ulong)uVar5 >> 0x10);
      bStack_184d = (byte)((ulong)uVar5 >> 0x18);
      bStack_184c = (byte)((ulong)uVar5 >> 0x20);
      bStack_184b = (byte)((ulong)uVar5 >> 0x28);
      bStack_184a = (byte)((ulong)uVar5 >> 0x30);
      bStack_1849 = (byte)((ulong)uVar5 >> 0x38);
      bStack_1860 = (byte)uVar11;
      bStack_185f = (byte)((ulong)uVar11 >> 8);
      bStack_185e = (byte)((ulong)uVar11 >> 0x10);
      bStack_185d = (byte)((ulong)uVar11 >> 0x18);
      bStack_185c = (byte)((ulong)uVar11 >> 0x20);
      bStack_185b = (byte)((ulong)uVar11 >> 0x28);
      bStack_185a = (byte)((ulong)uVar11 >> 0x30);
      bStack_1859 = (byte)((ulong)uVar11 >> 0x38);
      local_1d78 = (byte)uVar6;
      bStack_1d77 = (byte)((ulong)uVar6 >> 8);
      bStack_1d76 = (byte)((ulong)uVar6 >> 0x10);
      bStack_1d75 = (byte)((ulong)uVar6 >> 0x18);
      bStack_1d74 = (byte)((ulong)uVar6 >> 0x20);
      bStack_1d73 = (byte)((ulong)uVar6 >> 0x28);
      bStack_1d72 = (byte)((ulong)uVar6 >> 0x30);
      bStack_1d71 = (byte)((ulong)uVar6 >> 0x38);
      local_1d88 = (byte)uVar12;
      bStack_1d87 = (byte)((ulong)uVar12 >> 8);
      bStack_1d86 = (byte)((ulong)uVar12 >> 0x10);
      bStack_1d85 = (byte)((ulong)uVar12 >> 0x18);
      bStack_1d84 = (byte)((ulong)uVar12 >> 0x20);
      bStack_1d83 = (byte)((ulong)uVar12 >> 0x28);
      bStack_1d82 = (byte)((ulong)uVar12 >> 0x30);
      bStack_1d81 = (byte)((ulong)uVar12 >> 0x38);
      bStack_1870 = (byte)uVar7;
      bStack_186f = (byte)((ulong)uVar7 >> 8);
      bStack_186e = (byte)((ulong)uVar7 >> 0x10);
      bStack_186d = (byte)((ulong)uVar7 >> 0x18);
      bStack_186c = (byte)((ulong)uVar7 >> 0x20);
      bStack_186b = (byte)((ulong)uVar7 >> 0x28);
      bStack_186a = (byte)((ulong)uVar7 >> 0x30);
      bStack_1869 = (byte)((ulong)uVar7 >> 0x38);
      bStack_1880 = (byte)uVar13;
      bStack_187f = (byte)((ulong)uVar13 >> 8);
      bStack_187e = (byte)((ulong)uVar13 >> 0x10);
      bStack_187d = (byte)((ulong)uVar13 >> 0x18);
      bStack_187c = (byte)((ulong)uVar13 >> 0x20);
      bStack_187b = (byte)((ulong)uVar13 >> 0x28);
      bStack_187a = (byte)((ulong)uVar13 >> 0x30);
      bStack_1879 = (byte)((ulong)uVar13 >> 0x38);
      local_1d98 = (byte)uVar8;
      bStack_1d97 = (byte)((ulong)uVar8 >> 8);
      bStack_1d96 = (byte)((ulong)uVar8 >> 0x10);
      bStack_1d95 = (byte)((ulong)uVar8 >> 0x18);
      bStack_1d94 = (byte)((ulong)uVar8 >> 0x20);
      bStack_1d93 = (byte)((ulong)uVar8 >> 0x28);
      bStack_1d92 = (byte)((ulong)uVar8 >> 0x30);
      bStack_1d91 = (byte)((ulong)uVar8 >> 0x38);
      local_1da8 = (byte)uVar14;
      bStack_1da7 = (byte)((ulong)uVar14 >> 8);
      bStack_1da6 = (byte)((ulong)uVar14 >> 0x10);
      bStack_1da5 = (byte)((ulong)uVar14 >> 0x18);
      bStack_1da4 = (byte)((ulong)uVar14 >> 0x20);
      bStack_1da3 = (byte)((ulong)uVar14 >> 0x28);
      bStack_1da2 = (byte)((ulong)uVar14 >> 0x30);
      bStack_1da1 = (byte)((ulong)uVar14 >> 0x38);
      bStack_1890 = (byte)uVar9;
      bStack_188f = (byte)((ulong)uVar9 >> 8);
      bStack_188e = (byte)((ulong)uVar9 >> 0x10);
      bStack_188d = (byte)((ulong)uVar9 >> 0x18);
      bStack_188c = (byte)((ulong)uVar9 >> 0x20);
      bStack_188b = (byte)((ulong)uVar9 >> 0x28);
      bStack_188a = (byte)((ulong)uVar9 >> 0x30);
      bStack_1889 = (byte)((ulong)uVar9 >> 0x38);
      bStack_18a0 = (byte)uVar15;
      bStack_189f = (byte)((ulong)uVar15 >> 8);
      bStack_189e = (byte)((ulong)uVar15 >> 0x10);
      bStack_189d = (byte)((ulong)uVar15 >> 0x18);
      bStack_189c = (byte)((ulong)uVar15 >> 0x20);
      bStack_189b = (byte)((ulong)uVar15 >> 0x28);
      bStack_189a = (byte)((ulong)uVar15 >> 0x30);
      bStack_1899 = (byte)((ulong)uVar15 >> 0x38);
      bVar1 = pRVar23->r_factor;
      uStack_d56 = (ushort)bStack_1d52;
      uStack_d54 = (ushort)bStack_184c;
      uStack_d52 = (ushort)bStack_1d76;
      uStack_d4e = (ushort)bStack_186a;
      uStack_d4c = (ushort)bStack_1d94;
      uStack_d4a = (ushort)bStack_188e;
      uStack_d66 = (ushort)bVar1;
      uStack_d64 = (ushort)bVar1;
      uStack_d62 = (ushort)bVar1;
      uStack_d5e = (ushort)bVar1;
      uStack_d5c = (ushort)bVar1;
      uStack_d5a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_d76 = (ushort)bStack_1d51;
      uStack_d74 = (ushort)bStack_184b;
      uStack_d72 = (ushort)bStack_1d75;
      uStack_d6e = (ushort)bStack_1869;
      uStack_d6c = (ushort)bStack_1d93;
      uStack_d6a = (ushort)bStack_188d;
      uStack_d86 = (ushort)bVar2;
      uStack_d84 = (ushort)bVar2;
      uStack_d82 = (ushort)bVar2;
      uStack_d7e = (ushort)bVar2;
      uStack_d7c = (ushort)bVar2;
      uStack_d7a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_d96 = (ushort)bStack_1850;
      uStack_d94 = (ushort)bStack_184a;
      uStack_d92 = (ushort)bStack_1d74;
      uStack_d8e = (ushort)local_1d98;
      uStack_d8c = (ushort)bStack_1d92;
      uStack_d8a = (ushort)bStack_188c;
      uStack_da6 = (ushort)bVar3;
      uStack_da4 = (ushort)bVar3;
      uStack_da2 = (ushort)bVar3;
      uStack_d9e = (ushort)bVar3;
      uStack_d9c = (ushort)bVar3;
      uStack_d9a = (ushort)bVar3;
      uVar25 = (ushort)((ushort)local_1d58 * (ushort)bVar1 + (ushort)bStack_1d57 * (ushort)bVar2 +
                       (ushort)bStack_1d56 * (ushort)bVar3) >> 8;
      uVar29 = (ushort)(uStack_d56 * uStack_d66 + uStack_d76 * uStack_d86 + uStack_d96 * uStack_da6)
               >> 8;
      uVar33 = (ushort)(uStack_d54 * uStack_d64 + uStack_d74 * uStack_d84 + uStack_d94 * uStack_da4)
               >> 8;
      uVar37 = (ushort)(uStack_d52 * uStack_d62 + uStack_d72 * uStack_d82 + uStack_d92 * uStack_da2)
               >> 8;
      uVar41 = (ushort)((ushort)bStack_1870 * (ushort)bVar1 + (ushort)bStack_186f * (ushort)bVar2 +
                       (ushort)bStack_186e * (ushort)bVar3) >> 8;
      uVar49 = (ushort)(uStack_d4e * uStack_d5e + uStack_d6e * uStack_d7e + uStack_d8e * uStack_d9e)
               >> 8;
      uVar53 = (ushort)(uStack_d4c * uStack_d5c + uStack_d6c * uStack_d7c + uStack_d8c * uStack_d9c)
               >> 8;
      uVar57 = (ushort)(uStack_d4a * uStack_d5a + uStack_d6a * uStack_d7a + uStack_d8a * uStack_d9a)
               >> 8;
      uStack_8f6 = (ushort)bStack_1850;
      uStack_8f4 = (ushort)bStack_184a;
      uStack_8f2 = (ushort)bStack_1d74;
      uStack_8ee = (ushort)local_1d98;
      uStack_8ec = (ushort)bStack_1d92;
      uStack_8ea = (ushort)bStack_188c;
      uStack_916 = (ushort)bStack_1d52;
      uStack_914 = (ushort)bStack_184c;
      uStack_912 = (ushort)bStack_1d76;
      uStack_90e = (ushort)bStack_186a;
      uStack_90c = (ushort)bStack_1d94;
      uStack_90a = (ushort)bStack_188e;
      bVar1 = pRVar23->r_factor;
      uStack_db6 = (ushort)bStack_184f;
      uStack_db4 = (ushort)bStack_1849;
      uStack_db2 = (ushort)bStack_1d73;
      uStack_dae = (ushort)bStack_1d97;
      uStack_dac = (ushort)bStack_1d91;
      uStack_daa = (ushort)bStack_188b;
      uStack_dc6 = (ushort)bVar1;
      uStack_dc4 = (ushort)bVar1;
      uStack_dc2 = (ushort)bVar1;
      uStack_dbe = (ushort)bVar1;
      uStack_dbc = (ushort)bVar1;
      uStack_dba = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_dd6 = (ushort)bStack_184e;
      uStack_dd4 = (ushort)local_1d78;
      uStack_dd2 = (ushort)bStack_1d72;
      uStack_dce = (ushort)bStack_1d96;
      uStack_dcc = (ushort)bStack_1890;
      uStack_dca = (ushort)bStack_188a;
      uStack_de6 = (ushort)bVar2;
      uStack_de4 = (ushort)bVar2;
      uStack_de2 = (ushort)bVar2;
      uStack_dde = (ushort)bVar2;
      uStack_ddc = (ushort)bVar2;
      uStack_dda = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_df6 = (ushort)bStack_184d;
      uStack_df4 = (ushort)bStack_1d77;
      uStack_df2 = (ushort)bStack_1d71;
      uStack_dee = (ushort)bStack_1d95;
      uStack_dec = (ushort)bStack_188f;
      uStack_dea = (ushort)bStack_1889;
      uStack_e06 = (ushort)bVar3;
      uStack_e04 = (ushort)bVar3;
      uStack_e02 = (ushort)bVar3;
      uStack_dfe = (ushort)bVar3;
      uStack_dfc = (ushort)bVar3;
      uStack_dfa = (ushort)bVar3;
      uVar26 = (ushort)((ushort)bStack_1d55 * (ushort)bVar1 + (ushort)bStack_1d54 * (ushort)bVar2 +
                       (ushort)bStack_1d53 * (ushort)bVar3) >> 8;
      uVar30 = (ushort)(uStack_db6 * uStack_dc6 + uStack_dd6 * uStack_de6 + uStack_df6 * uStack_e06)
               >> 8;
      uVar34 = (ushort)(uStack_db4 * uStack_dc4 + uStack_dd4 * uStack_de4 + uStack_df4 * uStack_e04)
               >> 8;
      uVar38 = (ushort)(uStack_db2 * uStack_dc2 + uStack_dd2 * uStack_de2 + uStack_df2 * uStack_e02)
               >> 8;
      uVar42 = (ushort)((ushort)bStack_186d * (ushort)bVar1 + (ushort)bStack_186c * (ushort)bVar2 +
                       (ushort)bStack_186b * (ushort)bVar3) >> 8;
      uVar50 = (ushort)(uStack_dae * uStack_dbe + uStack_dce * uStack_dde + uStack_dee * uStack_dfe)
               >> 8;
      uVar54 = (ushort)(uStack_dac * uStack_dbc + uStack_dcc * uStack_ddc + uStack_dec * uStack_dfc)
               >> 8;
      uVar58 = (ushort)(uStack_daa * uStack_dba + uStack_dca * uStack_dda + uStack_dea * uStack_dfa)
               >> 8;
      uStack_936 = (ushort)bStack_184d;
      uStack_934 = (ushort)bStack_1d77;
      uStack_932 = (ushort)bStack_1d71;
      uStack_92e = (ushort)bStack_1d95;
      uStack_92c = (ushort)bStack_188f;
      uStack_92a = (ushort)bStack_1889;
      uStack_956 = (ushort)bStack_184f;
      uStack_954 = (ushort)bStack_1849;
      uStack_952 = (ushort)bStack_1d73;
      uStack_94e = (ushort)bStack_1d97;
      uStack_94c = (ushort)bStack_1d91;
      uStack_94a = (ushort)bStack_188b;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_e26 = (ushort)bVar1;
      uStack_e24 = (ushort)bVar1;
      uStack_e22 = (ushort)bVar1;
      uStack_e1e = (ushort)bVar1;
      uStack_e1c = (ushort)bVar1;
      uStack_e1a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_12a6 = (ushort)bVar2;
      uStack_12a4 = (ushort)bVar2;
      uStack_12a2 = (ushort)bVar2;
      uStack_129e = (ushort)bVar2;
      uStack_129c = (ushort)bVar2;
      uStack_129a = (ushort)bVar2;
      uVar27 = ((ushort)(uVar25 * bVar1) >> 7) + (ushort)bVar2;
      uStack_12a6 = ((ushort)(uVar29 * uStack_e26) >> 7) + uStack_12a6;
      uStack_12a4 = ((ushort)(uVar33 * uStack_e24) >> 7) + uStack_12a4;
      uStack_12a2 = ((ushort)(uVar37 * uStack_e22) >> 7) + uStack_12a2;
      uVar43 = ((ushort)(uVar41 * bVar1) >> 7) + (ushort)bVar2;
      uStack_129e = ((ushort)(uVar49 * uStack_e1e) >> 7) + uStack_129e;
      uStack_129c = ((ushort)(uVar53 * uStack_e1c) >> 7) + uStack_129c;
      uStack_129a = ((ushort)(uVar57 * uStack_e1a) >> 7) + uStack_129a;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_e46 = (ushort)bVar1;
      uStack_e44 = (ushort)bVar1;
      uStack_e42 = (ushort)bVar1;
      uStack_e3e = (ushort)bVar1;
      uStack_e3c = (ushort)bVar1;
      uStack_e3a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_12c6 = (ushort)bVar2;
      uStack_12c4 = (ushort)bVar2;
      uStack_12c2 = (ushort)bVar2;
      uStack_12be = (ushort)bVar2;
      uStack_12bc = (ushort)bVar2;
      uStack_12ba = (ushort)bVar2;
      uVar28 = ((ushort)(uVar26 * bVar1) >> 7) + (ushort)bVar2;
      uStack_12c6 = ((ushort)(uVar30 * uStack_e46) >> 7) + uStack_12c6;
      uStack_12c4 = ((ushort)(uVar34 * uStack_e44) >> 7) + uStack_12c4;
      uStack_12c2 = ((ushort)(uVar38 * uStack_e42) >> 7) + uStack_12c2;
      uVar44 = ((ushort)(uVar42 * bVar1) >> 7) + (ushort)bVar2;
      uStack_12be = ((ushort)(uVar50 * uStack_e3e) >> 7) + uStack_12be;
      uStack_12bc = ((ushort)(uVar54 * uStack_e3c) >> 7) + uStack_12bc;
      uStack_12ba = ((ushort)(uVar58 * uStack_e3a) >> 7) + uStack_12ba;
      *(ulong *)y_ptr2 =
           CONCAT17((uStack_12c2 != 0) * (uStack_12c2 < 0x100) * (char)uStack_12c2 -
                    (0xff < uStack_12c2),
                    CONCAT16((uStack_12a2 != 0) * (uStack_12a2 < 0x100) * (char)uStack_12a2 -
                             (0xff < uStack_12a2),
                             CONCAT15((uStack_12c4 != 0) * (uStack_12c4 < 0x100) * (char)uStack_12c4
                                      - (0xff < uStack_12c4),
                                      CONCAT14((uStack_12a4 != 0) * (uStack_12a4 < 0x100) *
                                               (char)uStack_12a4 - (0xff < uStack_12a4),
                                               CONCAT13((uStack_12c6 != 0) * (uStack_12c6 < 0x100) *
                                                        (char)uStack_12c6 - (0xff < uStack_12c6),
                                                        CONCAT12((uStack_12a6 != 0) *
                                                                 (uStack_12a6 < 0x100) *
                                                                 (char)uStack_12a6 -
                                                                 (0xff < uStack_12a6),
                                                                 CONCAT11((uVar28 != 0) *
                                                                          (uVar28 < 0x100) *
                                                                          (char)uVar28 -
                                                                          (0xff < uVar28),
                                                                          (uVar27 != 0) *
                                                                          (uVar27 < 0x100) *
                                                                          (char)uVar27 -
                                                                          (0xff < uVar27))))))));
      *(ulong *)(y_ptr2 + 8) =
           CONCAT17((uStack_12ba != 0) * (uStack_12ba < 0x100) * (char)uStack_12ba -
                    (0xff < uStack_12ba),
                    CONCAT16((uStack_129a != 0) * (uStack_129a < 0x100) * (char)uStack_129a -
                             (0xff < uStack_129a),
                             CONCAT15((uStack_12bc != 0) * (uStack_12bc < 0x100) * (char)uStack_12bc
                                      - (0xff < uStack_12bc),
                                      CONCAT14((uStack_129c != 0) * (uStack_129c < 0x100) *
                                               (char)uStack_129c - (0xff < uStack_129c),
                                               CONCAT13((uStack_12be != 0) * (uStack_12be < 0x100) *
                                                        (char)uStack_12be - (0xff < uStack_12be),
                                                        CONCAT12((uStack_129e != 0) *
                                                                 (uStack_129e < 0x100) *
                                                                 (char)uStack_129e -
                                                                 (0xff < uStack_129e),
                                                                 CONCAT11((uVar44 != 0) *
                                                                          (uVar44 < 0x100) *
                                                                          (char)uVar44 -
                                                                          (0xff < uVar44),
                                                                          (uVar43 != 0) *
                                                                          (uVar43 < 0x100) *
                                                                          (char)uVar43 -
                                                                          (0xff < uVar43))))))));
      bVar1 = pRVar23->r_factor;
      uStack_e56 = (ushort)bStack_1d62;
      uStack_e54 = (ushort)bStack_185c;
      uStack_e52 = (ushort)bStack_1d86;
      uStack_e4e = (ushort)bStack_187a;
      uStack_e4c = (ushort)bStack_1da4;
      uStack_e4a = (ushort)bStack_189e;
      uStack_e66 = (ushort)bVar1;
      uStack_e64 = (ushort)bVar1;
      uStack_e62 = (ushort)bVar1;
      uStack_e5e = (ushort)bVar1;
      uStack_e5c = (ushort)bVar1;
      uStack_e5a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_e76 = (ushort)bStack_1d61;
      uStack_e74 = (ushort)bStack_185b;
      uStack_e72 = (ushort)bStack_1d85;
      uStack_e6e = (ushort)bStack_1879;
      uStack_e6c = (ushort)bStack_1da3;
      uStack_e6a = (ushort)bStack_189d;
      uStack_e86 = (ushort)bVar2;
      uStack_e84 = (ushort)bVar2;
      uStack_e82 = (ushort)bVar2;
      uStack_e7e = (ushort)bVar2;
      uStack_e7c = (ushort)bVar2;
      uStack_e7a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_e96 = (ushort)bStack_1860;
      uStack_e94 = (ushort)bStack_185a;
      uStack_e92 = (ushort)bStack_1d84;
      uStack_e8e = (ushort)local_1da8;
      uStack_e8c = (ushort)bStack_1da2;
      uStack_e8a = (ushort)bStack_189c;
      uStack_ea6 = (ushort)bVar3;
      uStack_ea4 = (ushort)bVar3;
      uStack_ea2 = (ushort)bVar3;
      uStack_e9e = (ushort)bVar3;
      uStack_e9c = (ushort)bVar3;
      uStack_e9a = (ushort)bVar3;
      uVar27 = (ushort)((ushort)local_1d68 * (ushort)bVar1 + (ushort)bStack_1d67 * (ushort)bVar2 +
                       (ushort)bStack_1d66 * (ushort)bVar3) >> 8;
      uVar31 = (ushort)(uStack_e56 * uStack_e66 + uStack_e76 * uStack_e86 + uStack_e96 * uStack_ea6)
               >> 8;
      uVar35 = (ushort)(uStack_e54 * uStack_e64 + uStack_e74 * uStack_e84 + uStack_e94 * uStack_ea4)
               >> 8;
      uVar39 = (ushort)(uStack_e52 * uStack_e62 + uStack_e72 * uStack_e82 + uStack_e92 * uStack_ea2)
               >> 8;
      uVar45 = (ushort)((ushort)bStack_1880 * (ushort)bVar1 + (ushort)bStack_187f * (ushort)bVar2 +
                       (ushort)bStack_187e * (ushort)bVar3) >> 8;
      uVar51 = (ushort)(uStack_e4e * uStack_e5e + uStack_e6e * uStack_e7e + uStack_e8e * uStack_e9e)
               >> 8;
      uVar55 = (ushort)(uStack_e4c * uStack_e5c + uStack_e6c * uStack_e7c + uStack_e8c * uStack_e9c)
               >> 8;
      uVar59 = (ushort)(uStack_e4a * uStack_e5a + uStack_e6a * uStack_e7a + uStack_e8a * uStack_e9a)
               >> 8;
      uStack_976 = (ushort)bStack_1860;
      uStack_974 = (ushort)bStack_185a;
      uStack_972 = (ushort)bStack_1d84;
      uStack_96e = (ushort)local_1da8;
      uStack_96c = (ushort)bStack_1da2;
      uStack_96a = (ushort)bStack_189c;
      uStack_996 = (ushort)bStack_1d62;
      uStack_994 = (ushort)bStack_185c;
      uStack_992 = (ushort)bStack_1d86;
      uStack_98e = (ushort)bStack_187a;
      uStack_98c = (ushort)bStack_1da4;
      uStack_98a = (ushort)bStack_189e;
      bVar1 = pRVar23->r_factor;
      uStack_eb6 = (ushort)bStack_185f;
      uStack_eb4 = (ushort)bStack_1859;
      uStack_eb2 = (ushort)bStack_1d83;
      uStack_eae = (ushort)bStack_1da7;
      uStack_eac = (ushort)bStack_1da1;
      uStack_eaa = (ushort)bStack_189b;
      uStack_ec6 = (ushort)bVar1;
      uStack_ec4 = (ushort)bVar1;
      uStack_ec2 = (ushort)bVar1;
      uStack_ebe = (ushort)bVar1;
      uStack_ebc = (ushort)bVar1;
      uStack_eba = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_ed6 = (ushort)bStack_185e;
      uStack_ed4 = (ushort)local_1d88;
      uStack_ed2 = (ushort)bStack_1d82;
      uStack_ece = (ushort)bStack_1da6;
      uStack_ecc = (ushort)bStack_18a0;
      uStack_eca = (ushort)bStack_189a;
      uStack_ee6 = (ushort)bVar2;
      uStack_ee4 = (ushort)bVar2;
      uStack_ee2 = (ushort)bVar2;
      uStack_ede = (ushort)bVar2;
      uStack_edc = (ushort)bVar2;
      uStack_eda = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_ef6 = (ushort)bStack_185d;
      uStack_ef4 = (ushort)bStack_1d87;
      uStack_ef2 = (ushort)bStack_1d81;
      uStack_eee = (ushort)bStack_1da5;
      uStack_eec = (ushort)bStack_189f;
      uStack_eea = (ushort)bStack_1899;
      uStack_f06 = (ushort)bVar3;
      uStack_f04 = (ushort)bVar3;
      uStack_f02 = (ushort)bVar3;
      uStack_efe = (ushort)bVar3;
      uStack_efc = (ushort)bVar3;
      uStack_efa = (ushort)bVar3;
      uVar28 = (ushort)((ushort)bStack_1d65 * (ushort)bVar1 + (ushort)bStack_1d64 * (ushort)bVar2 +
                       (ushort)bStack_1d63 * (ushort)bVar3) >> 8;
      uVar32 = (ushort)(uStack_eb6 * uStack_ec6 + uStack_ed6 * uStack_ee6 + uStack_ef6 * uStack_f06)
               >> 8;
      uVar36 = (ushort)(uStack_eb4 * uStack_ec4 + uStack_ed4 * uStack_ee4 + uStack_ef4 * uStack_f04)
               >> 8;
      uVar40 = (ushort)(uStack_eb2 * uStack_ec2 + uStack_ed2 * uStack_ee2 + uStack_ef2 * uStack_f02)
               >> 8;
      uVar46 = (ushort)((ushort)bStack_187d * (ushort)bVar1 + (ushort)bStack_187c * (ushort)bVar2 +
                       (ushort)bStack_187b * (ushort)bVar3) >> 8;
      uVar52 = (ushort)(uStack_eae * uStack_ebe + uStack_ece * uStack_ede + uStack_eee * uStack_efe)
               >> 8;
      uVar56 = (ushort)(uStack_eac * uStack_ebc + uStack_ecc * uStack_edc + uStack_eec * uStack_efc)
               >> 8;
      uVar60 = (ushort)(uStack_eaa * uStack_eba + uStack_eca * uStack_eda + uStack_eea * uStack_efa)
               >> 8;
      uStack_9b6 = (ushort)bStack_185d;
      uStack_9b4 = (ushort)bStack_1d87;
      uStack_9b2 = (ushort)bStack_1d81;
      uStack_9ae = (ushort)bStack_1da5;
      uStack_9ac = (ushort)bStack_189f;
      uStack_9aa = (ushort)bStack_1899;
      uStack_9d6 = (ushort)bStack_185f;
      uStack_9d4 = (ushort)bStack_1859;
      uStack_9d2 = (ushort)bStack_1d83;
      uStack_9ce = (ushort)bStack_1da7;
      uStack_9cc = (ushort)bStack_1da1;
      uStack_9ca = (ushort)bStack_189b;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_f26 = (ushort)bVar1;
      uStack_f24 = (ushort)bVar1;
      uStack_f22 = (ushort)bVar1;
      uStack_f1e = (ushort)bVar1;
      uStack_f1c = (ushort)bVar1;
      uStack_f1a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_13e6 = (ushort)bVar2;
      uStack_13e4 = (ushort)bVar2;
      uStack_13e2 = (ushort)bVar2;
      uStack_13de = (ushort)bVar2;
      uStack_13dc = (ushort)bVar2;
      uStack_13da = (ushort)bVar2;
      uVar43 = ((ushort)(uVar27 * bVar1) >> 7) + (ushort)bVar2;
      uStack_13e6 = ((ushort)(uVar31 * uStack_f26) >> 7) + uStack_13e6;
      uStack_13e4 = ((ushort)(uVar35 * uStack_f24) >> 7) + uStack_13e4;
      uStack_13e2 = ((ushort)(uVar39 * uStack_f22) >> 7) + uStack_13e2;
      uVar47 = ((ushort)(uVar45 * bVar1) >> 7) + (ushort)bVar2;
      uStack_13de = ((ushort)(uVar51 * uStack_f1e) >> 7) + uStack_13de;
      uStack_13dc = ((ushort)(uVar55 * uStack_f1c) >> 7) + uStack_13dc;
      uStack_13da = ((ushort)(uVar59 * uStack_f1a) >> 7) + uStack_13da;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_f46 = (ushort)bVar1;
      uStack_f44 = (ushort)bVar1;
      uStack_f42 = (ushort)bVar1;
      uStack_f3e = (ushort)bVar1;
      uStack_f3c = (ushort)bVar1;
      uStack_f3a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_1406 = (ushort)bVar2;
      uStack_1404 = (ushort)bVar2;
      uStack_1402 = (ushort)bVar2;
      uStack_13fe = (ushort)bVar2;
      uStack_13fc = (ushort)bVar2;
      uStack_13fa = (ushort)bVar2;
      uVar44 = ((ushort)(uVar28 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1406 = ((ushort)(uVar32 * uStack_f46) >> 7) + uStack_1406;
      uStack_1404 = ((ushort)(uVar36 * uStack_f44) >> 7) + uStack_1404;
      uStack_1402 = ((ushort)(uVar40 * uStack_f42) >> 7) + uStack_1402;
      uVar48 = ((ushort)(uVar46 * bVar1) >> 7) + (ushort)bVar2;
      uStack_13fe = ((ushort)(uVar52 * uStack_f3e) >> 7) + uStack_13fe;
      uStack_13fc = ((ushort)(uVar56 * uStack_f3c) >> 7) + uStack_13fc;
      uStack_13fa = ((ushort)(uVar60 * uStack_f3a) >> 7) + uStack_13fa;
      *(ulong *)u_ptr =
           CONCAT17((uStack_1402 != 0) * (uStack_1402 < 0x100) * (char)uStack_1402 -
                    (0xff < uStack_1402),
                    CONCAT16((uStack_13e2 != 0) * (uStack_13e2 < 0x100) * (char)uStack_13e2 -
                             (0xff < uStack_13e2),
                             CONCAT15((uStack_1404 != 0) * (uStack_1404 < 0x100) * (char)uStack_1404
                                      - (0xff < uStack_1404),
                                      CONCAT14((uStack_13e4 != 0) * (uStack_13e4 < 0x100) *
                                               (char)uStack_13e4 - (0xff < uStack_13e4),
                                               CONCAT13((uStack_1406 != 0) * (uStack_1406 < 0x100) *
                                                        (char)uStack_1406 - (0xff < uStack_1406),
                                                        CONCAT12((uStack_13e6 != 0) *
                                                                 (uStack_13e6 < 0x100) *
                                                                 (char)uStack_13e6 -
                                                                 (0xff < uStack_13e6),
                                                                 CONCAT11((uVar44 != 0) *
                                                                          (uVar44 < 0x100) *
                                                                          (char)uVar44 -
                                                                          (0xff < uVar44),
                                                                          (uVar43 != 0) *
                                                                          (uVar43 < 0x100) *
                                                                          (char)uVar43 -
                                                                          (0xff < uVar43))))))));
      *(ulong *)(u_ptr + 8) =
           CONCAT17((uStack_13fa != 0) * (uStack_13fa < 0x100) * (char)uStack_13fa -
                    (0xff < uStack_13fa),
                    CONCAT16((uStack_13da != 0) * (uStack_13da < 0x100) * (char)uStack_13da -
                             (0xff < uStack_13da),
                             CONCAT15((uStack_13fc != 0) * (uStack_13fc < 0x100) * (char)uStack_13fc
                                      - (0xff < uStack_13fc),
                                      CONCAT14((uStack_13dc != 0) * (uStack_13dc < 0x100) *
                                               (char)uStack_13dc - (0xff < uStack_13dc),
                                               CONCAT13((uStack_13fe != 0) * (uStack_13fe < 0x100) *
                                                        (char)uStack_13fe - (0xff < uStack_13fe),
                                                        CONCAT12((uStack_13de != 0) *
                                                                 (uStack_13de < 0x100) *
                                                                 (char)uStack_13de -
                                                                 (0xff < uStack_13de),
                                                                 CONCAT11((uVar48 != 0) *
                                                                          (uVar48 < 0x100) *
                                                                          (char)uVar48 -
                                                                          (0xff < uVar48),
                                                                          (uVar47 != 0) *
                                                                          (uVar47 < 0x100) *
                                                                          (char)uVar47 -
                                                                          (0xff < uVar47))))))));
      auVar22._2_2_ =
           (uStack_8f6 - uVar29) + (uStack_936 - uVar30) + (uStack_976 - uVar31) +
           (uStack_9b6 - uVar32);
      auVar22._0_2_ =
           (bStack_1d56 - uVar25) + (bStack_1d53 - uVar26) + (bStack_1d66 - uVar27) +
           (bStack_1d63 - uVar28);
      auVar22._4_2_ =
           (uStack_8f4 - uVar33) + (uStack_934 - uVar34) + (uStack_974 - uVar35) +
           (uStack_9b4 - uVar36);
      auVar22._6_2_ =
           (uStack_8f2 - uVar37) + (uStack_932 - uVar38) + (uStack_972 - uVar39) +
           (uStack_9b2 - uVar40);
      auVar22._10_2_ =
           (uStack_8ee - uVar49) + (uStack_92e - uVar50) + (uStack_96e - uVar51) +
           (uStack_9ae - uVar52);
      auVar22._8_2_ =
           (bStack_186e - uVar41) + (bStack_186b - uVar42) + (bStack_187e - uVar45) +
           (bStack_187b - uVar46);
      auVar22._12_2_ =
           (uStack_8ec - uVar53) + (uStack_92c - uVar54) + (uStack_96c - uVar55) +
           (uStack_9ac - uVar56);
      auVar22._14_2_ =
           (uStack_8ea - uVar57) + (uStack_92a - uVar58) + (uStack_96a - uVar59) +
           (uStack_9aa - uVar60);
      auVar61 = psraw(auVar22,ZEXT416(2));
      bVar1 = RGB2YUV[uVar24].cb_factor;
      local_f58 = auVar61._0_2_;
      sStack_f56 = auVar61._2_2_;
      sStack_f54 = auVar61._4_2_;
      sStack_f52 = auVar61._6_2_;
      sStack_f50 = auVar61._8_2_;
      sStack_f4e = auVar61._10_2_;
      sStack_f4c = auVar61._12_2_;
      sStack_f4a = auVar61._14_2_;
      uStack_f66 = (ushort)bVar1;
      uStack_f64 = (ushort)bVar1;
      uStack_f62 = (ushort)bVar1;
      uStack_f5e = (ushort)bVar1;
      uStack_f5c = (ushort)bVar1;
      uStack_f5a = (ushort)bVar1;
      auVar21._2_2_ = sStack_f56 * uStack_f66;
      auVar21._0_2_ = local_f58 * (ushort)bVar1;
      auVar21._4_2_ = sStack_f54 * uStack_f64;
      auVar21._6_2_ = sStack_f52 * uStack_f62;
      auVar21._8_2_ = sStack_f50 * (ushort)bVar1;
      auVar21._10_2_ = sStack_f4e * uStack_f5e;
      auVar21._12_2_ = sStack_f4c * uStack_f5c;
      auVar21._14_2_ = sStack_f4a * uStack_f5a;
      auVar61 = psraw(auVar21,ZEXT416(8));
      local_1418 = auVar61._0_2_;
      sStack_1416 = auVar61._2_2_;
      sStack_1414 = auVar61._4_2_;
      sStack_1412 = auVar61._6_2_;
      sStack_1410 = auVar61._8_2_;
      sStack_140e = auVar61._10_2_;
      sStack_140c = auVar61._12_2_;
      sStack_140a = auVar61._14_2_;
      local_1418 = local_1418 + 0x80;
      sStack_1416 = sStack_1416 + 0x80;
      sStack_1414 = sStack_1414 + 0x80;
      sStack_1412 = sStack_1412 + 0x80;
      sStack_1410 = sStack_1410 + 0x80;
      sStack_140e = sStack_140e + 0x80;
      sStack_140c = sStack_140c + 0x80;
      sStack_140a = sStack_140a + 0x80;
      auVar20._2_2_ =
           (uStack_916 - uVar29) + (uStack_956 - uVar30) + (uStack_996 - uVar31) +
           (uStack_9d6 - uVar32);
      auVar20._0_2_ =
           (local_1d58 - uVar25) + (bStack_1d55 - uVar26) + (local_1d68 - uVar27) +
           (bStack_1d65 - uVar28);
      auVar20._4_2_ =
           (uStack_914 - uVar33) + (uStack_954 - uVar34) + (uStack_994 - uVar35) +
           (uStack_9d4 - uVar36);
      auVar20._6_2_ =
           (uStack_912 - uVar37) + (uStack_952 - uVar38) + (uStack_992 - uVar39) +
           (uStack_9d2 - uVar40);
      auVar20._10_2_ =
           (uStack_90e - uVar49) + (uStack_94e - uVar50) + (uStack_98e - uVar51) +
           (uStack_9ce - uVar52);
      auVar20._8_2_ =
           (bStack_1870 - uVar41) + (bStack_186d - uVar42) + (bStack_1880 - uVar45) +
           (bStack_187d - uVar46);
      auVar20._12_2_ =
           (uStack_90c - uVar53) + (uStack_94c - uVar54) + (uStack_98c - uVar55) +
           (uStack_9cc - uVar56);
      auVar20._14_2_ =
           (uStack_90a - uVar57) + (uStack_94a - uVar58) + (uStack_98a - uVar59) +
           (uStack_9ca - uVar60);
      auVar61 = psraw(auVar20,ZEXT416(2));
      bVar1 = RGB2YUV[uVar24].cr_factor;
      local_f78 = auVar61._0_2_;
      sStack_f76 = auVar61._2_2_;
      sStack_f74 = auVar61._4_2_;
      sStack_f72 = auVar61._6_2_;
      sStack_f70 = auVar61._8_2_;
      sStack_f6e = auVar61._10_2_;
      sStack_f6c = auVar61._12_2_;
      sStack_f6a = auVar61._14_2_;
      uStack_f86 = (ushort)bVar1;
      uStack_f84 = (ushort)bVar1;
      uStack_f82 = (ushort)bVar1;
      uStack_f7e = (ushort)bVar1;
      uStack_f7c = (ushort)bVar1;
      uStack_f7a = (ushort)bVar1;
      auVar19._2_2_ = sStack_f76 * uStack_f86;
      auVar19._0_2_ = local_f78 * (ushort)bVar1;
      auVar19._4_2_ = sStack_f74 * uStack_f84;
      auVar19._6_2_ = sStack_f72 * uStack_f82;
      auVar19._8_2_ = sStack_f70 * (ushort)bVar1;
      auVar19._10_2_ = sStack_f6e * uStack_f7e;
      auVar19._12_2_ = sStack_f6c * uStack_f7c;
      auVar19._14_2_ = sStack_f6a * uStack_f7a;
      auVar61 = psraw(auVar19,ZEXT416(8));
      local_1438 = auVar61._0_2_;
      sStack_1436 = auVar61._2_2_;
      sStack_1434 = auVar61._4_2_;
      sStack_1432 = auVar61._6_2_;
      sStack_1430 = auVar61._8_2_;
      sStack_142e = auVar61._10_2_;
      sStack_142c = auVar61._12_2_;
      sStack_142a = auVar61._14_2_;
      local_1438 = local_1438 + 0x80;
      sStack_1436 = sStack_1436 + 0x80;
      sStack_1434 = sStack_1434 + 0x80;
      sStack_1432 = sStack_1432 + 0x80;
      sStack_1430 = sStack_1430 + 0x80;
      sStack_142e = sStack_142e + 0x80;
      sStack_142c = sStack_142c + 0x80;
      sStack_142a = sStack_142a + 0x80;
      uVar4 = *(undefined8 *)(rgb_ptr2 + 0x30);
      uVar5 = *(undefined8 *)(rgb_ptr2 + 0x38);
      uVar6 = *(undefined8 *)(rgb_ptr2 + 0x40);
      uVar7 = *(undefined8 *)(rgb_ptr2 + 0x48);
      uVar8 = *(undefined8 *)(rgb_ptr2 + 0x50);
      uVar9 = *(undefined8 *)(rgb_ptr2 + 0x58);
      uVar10 = *(undefined8 *)(y_ptr1 + 0x30);
      uVar11 = *(undefined8 *)(y_ptr1 + 0x38);
      uVar12 = *(undefined8 *)(y_ptr1 + 0x40);
      uVar13 = *(undefined8 *)(y_ptr1 + 0x48);
      uVar14 = *(undefined8 *)(y_ptr1 + 0x50);
      uVar15 = *(undefined8 *)(y_ptr1 + 0x58);
      local_1f98 = (byte)uVar4;
      bStack_1f97 = (byte)((ulong)uVar4 >> 8);
      bStack_1f96 = (byte)((ulong)uVar4 >> 0x10);
      bStack_1f95 = (byte)((ulong)uVar4 >> 0x18);
      bStack_1f94 = (byte)((ulong)uVar4 >> 0x20);
      bStack_1f93 = (byte)((ulong)uVar4 >> 0x28);
      bStack_1f92 = (byte)((ulong)uVar4 >> 0x30);
      bStack_1f91 = (byte)((ulong)uVar4 >> 0x38);
      local_1fa8 = (byte)uVar10;
      bStack_1fa7 = (byte)((ulong)uVar10 >> 8);
      bStack_1fa6 = (byte)((ulong)uVar10 >> 0x10);
      bStack_1fa5 = (byte)((ulong)uVar10 >> 0x18);
      bStack_1fa4 = (byte)((ulong)uVar10 >> 0x20);
      bStack_1fa3 = (byte)((ulong)uVar10 >> 0x28);
      bStack_1fa2 = (byte)((ulong)uVar10 >> 0x30);
      bStack_1fa1 = (byte)((ulong)uVar10 >> 0x38);
      bStack_1ad0 = (byte)uVar5;
      bStack_1acf = (byte)((ulong)uVar5 >> 8);
      bStack_1ace = (byte)((ulong)uVar5 >> 0x10);
      bStack_1acd = (byte)((ulong)uVar5 >> 0x18);
      bStack_1acc = (byte)((ulong)uVar5 >> 0x20);
      bStack_1acb = (byte)((ulong)uVar5 >> 0x28);
      bStack_1aca = (byte)((ulong)uVar5 >> 0x30);
      bStack_1ac9 = (byte)((ulong)uVar5 >> 0x38);
      bStack_1ae0 = (byte)uVar11;
      bStack_1adf = (byte)((ulong)uVar11 >> 8);
      bStack_1ade = (byte)((ulong)uVar11 >> 0x10);
      bStack_1add = (byte)((ulong)uVar11 >> 0x18);
      bStack_1adc = (byte)((ulong)uVar11 >> 0x20);
      bStack_1adb = (byte)((ulong)uVar11 >> 0x28);
      bStack_1ada = (byte)((ulong)uVar11 >> 0x30);
      bStack_1ad9 = (byte)((ulong)uVar11 >> 0x38);
      local_1fb8 = (byte)uVar6;
      bStack_1fb7 = (byte)((ulong)uVar6 >> 8);
      bStack_1fb6 = (byte)((ulong)uVar6 >> 0x10);
      bStack_1fb5 = (byte)((ulong)uVar6 >> 0x18);
      bStack_1fb4 = (byte)((ulong)uVar6 >> 0x20);
      bStack_1fb3 = (byte)((ulong)uVar6 >> 0x28);
      bStack_1fb2 = (byte)((ulong)uVar6 >> 0x30);
      bStack_1fb1 = (byte)((ulong)uVar6 >> 0x38);
      local_1fc8 = (byte)uVar12;
      bStack_1fc7 = (byte)((ulong)uVar12 >> 8);
      bStack_1fc6 = (byte)((ulong)uVar12 >> 0x10);
      bStack_1fc5 = (byte)((ulong)uVar12 >> 0x18);
      bStack_1fc4 = (byte)((ulong)uVar12 >> 0x20);
      bStack_1fc3 = (byte)((ulong)uVar12 >> 0x28);
      bStack_1fc2 = (byte)((ulong)uVar12 >> 0x30);
      bStack_1fc1 = (byte)((ulong)uVar12 >> 0x38);
      bStack_1af0 = (byte)uVar7;
      bStack_1aef = (byte)((ulong)uVar7 >> 8);
      bStack_1aee = (byte)((ulong)uVar7 >> 0x10);
      bStack_1aed = (byte)((ulong)uVar7 >> 0x18);
      bStack_1aec = (byte)((ulong)uVar7 >> 0x20);
      bStack_1aeb = (byte)((ulong)uVar7 >> 0x28);
      bStack_1aea = (byte)((ulong)uVar7 >> 0x30);
      bStack_1ae9 = (byte)((ulong)uVar7 >> 0x38);
      bStack_1b00 = (byte)uVar13;
      bStack_1aff = (byte)((ulong)uVar13 >> 8);
      bStack_1afe = (byte)((ulong)uVar13 >> 0x10);
      bStack_1afd = (byte)((ulong)uVar13 >> 0x18);
      bStack_1afc = (byte)((ulong)uVar13 >> 0x20);
      bStack_1afb = (byte)((ulong)uVar13 >> 0x28);
      bStack_1afa = (byte)((ulong)uVar13 >> 0x30);
      bStack_1af9 = (byte)((ulong)uVar13 >> 0x38);
      local_1fd8 = (byte)uVar8;
      bStack_1fd7 = (byte)((ulong)uVar8 >> 8);
      bStack_1fd6 = (byte)((ulong)uVar8 >> 0x10);
      bStack_1fd5 = (byte)((ulong)uVar8 >> 0x18);
      bStack_1fd4 = (byte)((ulong)uVar8 >> 0x20);
      bStack_1fd3 = (byte)((ulong)uVar8 >> 0x28);
      bStack_1fd2 = (byte)((ulong)uVar8 >> 0x30);
      bStack_1fd1 = (byte)((ulong)uVar8 >> 0x38);
      local_1fe8 = (byte)uVar14;
      bStack_1fe7 = (byte)((ulong)uVar14 >> 8);
      bStack_1fe6 = (byte)((ulong)uVar14 >> 0x10);
      bStack_1fe5 = (byte)((ulong)uVar14 >> 0x18);
      bStack_1fe4 = (byte)((ulong)uVar14 >> 0x20);
      bStack_1fe3 = (byte)((ulong)uVar14 >> 0x28);
      bStack_1fe2 = (byte)((ulong)uVar14 >> 0x30);
      bStack_1fe1 = (byte)((ulong)uVar14 >> 0x38);
      bStack_1b10 = (byte)uVar9;
      bStack_1b0f = (byte)((ulong)uVar9 >> 8);
      bStack_1b0e = (byte)((ulong)uVar9 >> 0x10);
      bStack_1b0d = (byte)((ulong)uVar9 >> 0x18);
      bStack_1b0c = (byte)((ulong)uVar9 >> 0x20);
      bStack_1b0b = (byte)((ulong)uVar9 >> 0x28);
      bStack_1b0a = (byte)((ulong)uVar9 >> 0x30);
      bStack_1b09 = (byte)((ulong)uVar9 >> 0x38);
      bStack_1b20 = (byte)uVar15;
      bStack_1b1f = (byte)((ulong)uVar15 >> 8);
      bStack_1b1e = (byte)((ulong)uVar15 >> 0x10);
      bStack_1b1d = (byte)((ulong)uVar15 >> 0x18);
      bStack_1b1c = (byte)((ulong)uVar15 >> 0x20);
      bStack_1b1b = (byte)((ulong)uVar15 >> 0x28);
      bStack_1b1a = (byte)((ulong)uVar15 >> 0x30);
      bStack_1b19 = (byte)((ulong)uVar15 >> 0x38);
      bVar1 = pRVar23->r_factor;
      uStack_f96 = (ushort)bStack_1f92;
      uStack_f94 = (ushort)bStack_1acc;
      uStack_f92 = (ushort)bStack_1fb6;
      uStack_f8e = (ushort)bStack_1aea;
      uStack_f8c = (ushort)bStack_1fd4;
      uStack_f8a = (ushort)bStack_1b0e;
      uStack_fa6 = (ushort)bVar1;
      uStack_fa4 = (ushort)bVar1;
      uStack_fa2 = (ushort)bVar1;
      uStack_f9e = (ushort)bVar1;
      uStack_f9c = (ushort)bVar1;
      uStack_f9a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_fb6 = (ushort)bStack_1f91;
      uStack_fb4 = (ushort)bStack_1acb;
      uStack_fb2 = (ushort)bStack_1fb5;
      uStack_fae = (ushort)bStack_1ae9;
      uStack_fac = (ushort)bStack_1fd3;
      uStack_faa = (ushort)bStack_1b0d;
      uStack_fc6 = (ushort)bVar2;
      uStack_fc4 = (ushort)bVar2;
      uStack_fc2 = (ushort)bVar2;
      uStack_fbe = (ushort)bVar2;
      uStack_fbc = (ushort)bVar2;
      uStack_fba = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_fd6 = (ushort)bStack_1ad0;
      uStack_fd4 = (ushort)bStack_1aca;
      uStack_fd2 = (ushort)bStack_1fb4;
      uStack_fce = (ushort)local_1fd8;
      uStack_fcc = (ushort)bStack_1fd2;
      uStack_fca = (ushort)bStack_1b0c;
      uStack_fe6 = (ushort)bVar3;
      uStack_fe4 = (ushort)bVar3;
      uStack_fe2 = (ushort)bVar3;
      uStack_fde = (ushort)bVar3;
      uStack_fdc = (ushort)bVar3;
      uStack_fda = (ushort)bVar3;
      uVar35 = (ushort)((ushort)local_1f98 * (ushort)bVar1 + (ushort)bStack_1f97 * (ushort)bVar2 +
                       (ushort)bStack_1f96 * (ushort)bVar3) >> 8;
      uVar38 = (ushort)(uStack_f96 * uStack_fa6 + uStack_fb6 * uStack_fc6 + uStack_fd6 * uStack_fe6)
               >> 8;
      uVar41 = (ushort)(uStack_f94 * uStack_fa4 + uStack_fb4 * uStack_fc4 + uStack_fd4 * uStack_fe4)
               >> 8;
      uVar46 = (ushort)(uStack_f92 * uStack_fa2 + uStack_fb2 * uStack_fc2 + uStack_fd2 * uStack_fe2)
               >> 8;
      uVar49 = (ushort)((ushort)bStack_1af0 * (ushort)bVar1 + (ushort)bStack_1aef * (ushort)bVar2 +
                       (ushort)bStack_1aee * (ushort)bVar3) >> 8;
      uVar52 = (ushort)(uStack_f8e * uStack_f9e + uStack_fae * uStack_fbe + uStack_fce * uStack_fde)
               >> 8;
      uVar55 = (ushort)(uStack_f8c * uStack_f9c + uStack_fac * uStack_fbc + uStack_fcc * uStack_fdc)
               >> 8;
      uVar58 = (ushort)(uStack_f8a * uStack_f9a + uStack_faa * uStack_fba + uStack_fca * uStack_fda)
               >> 8;
      uStack_9f6 = (ushort)bStack_1ad0;
      uStack_9f4 = (ushort)bStack_1aca;
      uStack_9f2 = (ushort)bStack_1fb4;
      uStack_9ee = (ushort)local_1fd8;
      uStack_9ec = (ushort)bStack_1fd2;
      uStack_9ea = (ushort)bStack_1b0c;
      uStack_a16 = (ushort)bStack_1f92;
      uStack_a14 = (ushort)bStack_1acc;
      uStack_a12 = (ushort)bStack_1fb6;
      uStack_a0e = (ushort)bStack_1aea;
      uStack_a0c = (ushort)bStack_1fd4;
      uStack_a0a = (ushort)bStack_1b0e;
      bVar1 = pRVar23->r_factor;
      uStack_ff6 = (ushort)bStack_1acf;
      uStack_ff4 = (ushort)bStack_1ac9;
      uStack_ff2 = (ushort)bStack_1fb3;
      uStack_fee = (ushort)bStack_1fd7;
      uStack_fec = (ushort)bStack_1fd1;
      uStack_fea = (ushort)bStack_1b0b;
      uStack_1006 = (ushort)bVar1;
      uStack_1004 = (ushort)bVar1;
      uStack_1002 = (ushort)bVar1;
      uStack_ffe = (ushort)bVar1;
      uStack_ffc = (ushort)bVar1;
      uStack_ffa = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_1016 = (ushort)bStack_1ace;
      uStack_1014 = (ushort)local_1fb8;
      uStack_1012 = (ushort)bStack_1fb2;
      uStack_100e = (ushort)bStack_1fd6;
      uStack_100c = (ushort)bStack_1b10;
      uStack_100a = (ushort)bStack_1b0a;
      uStack_1026 = (ushort)bVar2;
      uStack_1024 = (ushort)bVar2;
      uStack_1022 = (ushort)bVar2;
      uStack_101e = (ushort)bVar2;
      uStack_101c = (ushort)bVar2;
      uStack_101a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_1036 = (ushort)bStack_1acd;
      uStack_1034 = (ushort)bStack_1fb7;
      uStack_1032 = (ushort)bStack_1fb1;
      uStack_102e = (ushort)bStack_1fd5;
      uStack_102c = (ushort)bStack_1b0f;
      uStack_102a = (ushort)bStack_1b09;
      uStack_1046 = (ushort)bVar3;
      uStack_1044 = (ushort)bVar3;
      uStack_1042 = (ushort)bVar3;
      uStack_103e = (ushort)bVar3;
      uStack_103c = (ushort)bVar3;
      uStack_103a = (ushort)bVar3;
      uVar36 = (ushort)((ushort)bStack_1f95 * (ushort)bVar1 + (ushort)bStack_1f94 * (ushort)bVar2 +
                       (ushort)bStack_1f93 * (ushort)bVar3) >> 8;
      uVar39 = (ushort)(uStack_ff6 * uStack_1006 + uStack_1016 * uStack_1026 +
                       uStack_1036 * uStack_1046) >> 8;
      uVar42 = (ushort)(uStack_ff4 * uStack_1004 + uStack_1014 * uStack_1024 +
                       uStack_1034 * uStack_1044) >> 8;
      uVar47 = (ushort)(uStack_ff2 * uStack_1002 + uStack_1012 * uStack_1022 +
                       uStack_1032 * uStack_1042) >> 8;
      uVar50 = (ushort)((ushort)bStack_1aed * (ushort)bVar1 + (ushort)bStack_1aec * (ushort)bVar2 +
                       (ushort)bStack_1aeb * (ushort)bVar3) >> 8;
      uVar53 = (ushort)(uStack_fee * uStack_ffe + uStack_100e * uStack_101e +
                       uStack_102e * uStack_103e) >> 8;
      uVar56 = (ushort)(uStack_fec * uStack_ffc + uStack_100c * uStack_101c +
                       uStack_102c * uStack_103c) >> 8;
      uVar59 = (ushort)(uStack_fea * uStack_ffa + uStack_100a * uStack_101a +
                       uStack_102a * uStack_103a) >> 8;
      uStack_a36 = (ushort)bStack_1acd;
      uStack_a34 = (ushort)bStack_1fb7;
      uStack_a32 = (ushort)bStack_1fb1;
      uStack_a2e = (ushort)bStack_1fd5;
      uStack_a2c = (ushort)bStack_1b0f;
      uStack_a2a = (ushort)bStack_1b09;
      uStack_a56 = (ushort)bStack_1acf;
      uStack_a54 = (ushort)bStack_1ac9;
      uStack_a52 = (ushort)bStack_1fb3;
      uStack_a4e = (ushort)bStack_1fd7;
      uStack_a4c = (ushort)bStack_1fd1;
      uStack_a4a = (ushort)bStack_1b0b;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_1066 = (ushort)bVar1;
      uStack_1064 = (ushort)bVar1;
      uStack_1062 = (ushort)bVar1;
      uStack_105e = (ushort)bVar1;
      uStack_105c = (ushort)bVar1;
      uStack_105a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_1526 = (ushort)bVar2;
      uStack_1524 = (ushort)bVar2;
      uStack_1522 = (ushort)bVar2;
      uStack_151e = (ushort)bVar2;
      uStack_151c = (ushort)bVar2;
      uStack_151a = (ushort)bVar2;
      uVar25 = ((ushort)(uVar35 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1526 = ((ushort)(uVar38 * uStack_1066) >> 7) + uStack_1526;
      uStack_1524 = ((ushort)(uVar41 * uStack_1064) >> 7) + uStack_1524;
      uStack_1522 = ((ushort)(uVar46 * uStack_1062) >> 7) + uStack_1522;
      uVar27 = ((ushort)(uVar49 * bVar1) >> 7) + (ushort)bVar2;
      uStack_151e = ((ushort)(uVar52 * uStack_105e) >> 7) + uStack_151e;
      uStack_151c = ((ushort)(uVar55 * uStack_105c) >> 7) + uStack_151c;
      uStack_151a = ((ushort)(uVar58 * uStack_105a) >> 7) + uStack_151a;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_1086 = (ushort)bVar1;
      uStack_1084 = (ushort)bVar1;
      uStack_1082 = (ushort)bVar1;
      uStack_107e = (ushort)bVar1;
      uStack_107c = (ushort)bVar1;
      uStack_107a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_1546 = (ushort)bVar2;
      uStack_1544 = (ushort)bVar2;
      uStack_1542 = (ushort)bVar2;
      uStack_153e = (ushort)bVar2;
      uStack_153c = (ushort)bVar2;
      uStack_153a = (ushort)bVar2;
      uVar26 = ((ushort)(uVar36 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1546 = ((ushort)(uVar39 * uStack_1086) >> 7) + uStack_1546;
      uStack_1544 = ((ushort)(uVar42 * uStack_1084) >> 7) + uStack_1544;
      uStack_1542 = ((ushort)(uVar47 * uStack_1082) >> 7) + uStack_1542;
      uVar28 = ((ushort)(uVar50 * bVar1) >> 7) + (ushort)bVar2;
      uStack_153e = ((ushort)(uVar53 * uStack_107e) >> 7) + uStack_153e;
      uStack_153c = ((ushort)(uVar56 * uStack_107c) >> 7) + uStack_153c;
      uStack_153a = ((ushort)(uVar59 * uStack_107a) >> 7) + uStack_153a;
      *(ulong *)(y_ptr2 + 0x10) =
           CONCAT17((uStack_1542 != 0) * (uStack_1542 < 0x100) * (char)uStack_1542 -
                    (0xff < uStack_1542),
                    CONCAT16((uStack_1522 != 0) * (uStack_1522 < 0x100) * (char)uStack_1522 -
                             (0xff < uStack_1522),
                             CONCAT15((uStack_1544 != 0) * (uStack_1544 < 0x100) * (char)uStack_1544
                                      - (0xff < uStack_1544),
                                      CONCAT14((uStack_1524 != 0) * (uStack_1524 < 0x100) *
                                               (char)uStack_1524 - (0xff < uStack_1524),
                                               CONCAT13((uStack_1546 != 0) * (uStack_1546 < 0x100) *
                                                        (char)uStack_1546 - (0xff < uStack_1546),
                                                        CONCAT12((uStack_1526 != 0) *
                                                                 (uStack_1526 < 0x100) *
                                                                 (char)uStack_1526 -
                                                                 (0xff < uStack_1526),
                                                                 CONCAT11((uVar26 != 0) *
                                                                          (uVar26 < 0x100) *
                                                                          (char)uVar26 -
                                                                          (0xff < uVar26),
                                                                          (uVar25 != 0) *
                                                                          (uVar25 < 0x100) *
                                                                          (char)uVar25 -
                                                                          (0xff < uVar25))))))));
      *(ulong *)(y_ptr2 + 0x18) =
           CONCAT17((uStack_153a != 0) * (uStack_153a < 0x100) * (char)uStack_153a -
                    (0xff < uStack_153a),
                    CONCAT16((uStack_151a != 0) * (uStack_151a < 0x100) * (char)uStack_151a -
                             (0xff < uStack_151a),
                             CONCAT15((uStack_153c != 0) * (uStack_153c < 0x100) * (char)uStack_153c
                                      - (0xff < uStack_153c),
                                      CONCAT14((uStack_151c != 0) * (uStack_151c < 0x100) *
                                               (char)uStack_151c - (0xff < uStack_151c),
                                               CONCAT13((uStack_153e != 0) * (uStack_153e < 0x100) *
                                                        (char)uStack_153e - (0xff < uStack_153e),
                                                        CONCAT12((uStack_151e != 0) *
                                                                 (uStack_151e < 0x100) *
                                                                 (char)uStack_151e -
                                                                 (0xff < uStack_151e),
                                                                 CONCAT11((uVar28 != 0) *
                                                                          (uVar28 < 0x100) *
                                                                          (char)uVar28 -
                                                                          (0xff < uVar28),
                                                                          (uVar27 != 0) *
                                                                          (uVar27 < 0x100) *
                                                                          (char)uVar27 -
                                                                          (0xff < uVar27))))))));
      bVar1 = pRVar23->r_factor;
      uStack_1096 = (ushort)bStack_1fa2;
      uStack_1094 = (ushort)bStack_1adc;
      uStack_1092 = (ushort)bStack_1fc6;
      uStack_108e = (ushort)bStack_1afa;
      uStack_108c = (ushort)bStack_1fe4;
      uStack_108a = (ushort)bStack_1b1e;
      uStack_10a6 = (ushort)bVar1;
      uStack_10a4 = (ushort)bVar1;
      uStack_10a2 = (ushort)bVar1;
      uStack_109e = (ushort)bVar1;
      uStack_109c = (ushort)bVar1;
      uStack_109a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_10b6 = (ushort)bStack_1fa1;
      uStack_10b4 = (ushort)bStack_1adb;
      uStack_10b2 = (ushort)bStack_1fc5;
      uStack_10ae = (ushort)bStack_1af9;
      uStack_10ac = (ushort)bStack_1fe3;
      uStack_10aa = (ushort)bStack_1b1d;
      uStack_10c6 = (ushort)bVar2;
      uStack_10c4 = (ushort)bVar2;
      uStack_10c2 = (ushort)bVar2;
      uStack_10be = (ushort)bVar2;
      uStack_10bc = (ushort)bVar2;
      uStack_10ba = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_10d6 = (ushort)bStack_1ae0;
      uStack_10d4 = (ushort)bStack_1ada;
      uStack_10d2 = (ushort)bStack_1fc4;
      uStack_10ce = (ushort)local_1fe8;
      uStack_10cc = (ushort)bStack_1fe2;
      uStack_10ca = (ushort)bStack_1b1c;
      uStack_10e6 = (ushort)bVar3;
      uStack_10e4 = (ushort)bVar3;
      uStack_10e2 = (ushort)bVar3;
      uStack_10de = (ushort)bVar3;
      uStack_10dc = (ushort)bVar3;
      uStack_10da = (ushort)bVar3;
      uVar37 = (ushort)((ushort)local_1fa8 * (ushort)bVar1 + (ushort)bStack_1fa7 * (ushort)bVar2 +
                       (ushort)bStack_1fa6 * (ushort)bVar3) >> 8;
      uVar40 = (ushort)(uStack_1096 * uStack_10a6 + uStack_10b6 * uStack_10c6 +
                       uStack_10d6 * uStack_10e6) >> 8;
      uVar45 = (ushort)(uStack_1094 * uStack_10a4 + uStack_10b4 * uStack_10c4 +
                       uStack_10d4 * uStack_10e4) >> 8;
      uVar48 = (ushort)(uStack_1092 * uStack_10a2 + uStack_10b2 * uStack_10c2 +
                       uStack_10d2 * uStack_10e2) >> 8;
      uVar51 = (ushort)((ushort)bStack_1b00 * (ushort)bVar1 + (ushort)bStack_1aff * (ushort)bVar2 +
                       (ushort)bStack_1afe * (ushort)bVar3) >> 8;
      uVar54 = (ushort)(uStack_108e * uStack_109e + uStack_10ae * uStack_10be +
                       uStack_10ce * uStack_10de) >> 8;
      uVar57 = (ushort)(uStack_108c * uStack_109c + uStack_10ac * uStack_10bc +
                       uStack_10cc * uStack_10dc) >> 8;
      uVar60 = (ushort)(uStack_108a * uStack_109a + uStack_10aa * uStack_10ba +
                       uStack_10ca * uStack_10da) >> 8;
      uStack_a76 = (ushort)bStack_1ae0;
      uStack_a74 = (ushort)bStack_1ada;
      uStack_a72 = (ushort)bStack_1fc4;
      uStack_a6e = (ushort)local_1fe8;
      uStack_a6c = (ushort)bStack_1fe2;
      uStack_a6a = (ushort)bStack_1b1c;
      uStack_a96 = (ushort)bStack_1fa2;
      uStack_a94 = (ushort)bStack_1adc;
      uStack_a92 = (ushort)bStack_1fc6;
      uStack_a8e = (ushort)bStack_1afa;
      uStack_a8c = (ushort)bStack_1fe4;
      uStack_a8a = (ushort)bStack_1b1e;
      bVar1 = pRVar23->r_factor;
      uStack_10f6 = (ushort)bStack_1adf;
      uStack_10f4 = (ushort)bStack_1ad9;
      uStack_10f2 = (ushort)bStack_1fc3;
      uStack_10ee = (ushort)bStack_1fe7;
      uStack_10ec = (ushort)bStack_1fe1;
      uStack_10ea = (ushort)bStack_1b1b;
      uStack_1106 = (ushort)bVar1;
      uStack_1104 = (ushort)bVar1;
      uStack_1102 = (ushort)bVar1;
      uStack_10fe = (ushort)bVar1;
      uStack_10fc = (ushort)bVar1;
      uStack_10fa = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].g_factor;
      uStack_1116 = (ushort)bStack_1ade;
      uStack_1114 = (ushort)local_1fc8;
      uStack_1112 = (ushort)bStack_1fc2;
      uStack_110e = (ushort)bStack_1fe6;
      uStack_110c = (ushort)bStack_1b20;
      uStack_110a = (ushort)bStack_1b1a;
      uStack_1126 = (ushort)bVar2;
      uStack_1124 = (ushort)bVar2;
      uStack_1122 = (ushort)bVar2;
      uStack_111e = (ushort)bVar2;
      uStack_111c = (ushort)bVar2;
      uStack_111a = (ushort)bVar2;
      bVar3 = RGB2YUV[uVar24].b_factor;
      uStack_1136 = (ushort)bStack_1add;
      uStack_1134 = (ushort)bStack_1fc7;
      uStack_1132 = (ushort)bStack_1fc1;
      uStack_112e = (ushort)bStack_1fe5;
      uStack_112c = (ushort)bStack_1b1f;
      uStack_112a = (ushort)bStack_1b19;
      uStack_1146 = (ushort)bVar3;
      uStack_1144 = (ushort)bVar3;
      uStack_1142 = (ushort)bVar3;
      uStack_113e = (ushort)bVar3;
      uStack_113c = (ushort)bVar3;
      uStack_113a = (ushort)bVar3;
      uVar25 = (ushort)((ushort)bStack_1fa5 * (ushort)bVar1 + (ushort)bStack_1fa4 * (ushort)bVar2 +
                       (ushort)bStack_1fa3 * (ushort)bVar3) >> 8;
      uVar28 = (ushort)(uStack_10f6 * uStack_1106 + uStack_1116 * uStack_1126 +
                       uStack_1136 * uStack_1146) >> 8;
      uVar43 = (ushort)(uStack_10f4 * uStack_1104 + uStack_1114 * uStack_1124 +
                       uStack_1134 * uStack_1144) >> 8;
      uVar44 = (ushort)(uStack_10f2 * uStack_1102 + uStack_1112 * uStack_1122 +
                       uStack_1132 * uStack_1142) >> 8;
      uVar29 = (ushort)((ushort)bStack_1afd * (ushort)bVar1 + (ushort)bStack_1afc * (ushort)bVar2 +
                       (ushort)bStack_1afb * (ushort)bVar3) >> 8;
      uVar32 = (ushort)(uStack_10ee * uStack_10fe + uStack_110e * uStack_111e +
                       uStack_112e * uStack_113e) >> 8;
      uVar33 = (ushort)(uStack_10ec * uStack_10fc + uStack_110c * uStack_111c +
                       uStack_112c * uStack_113c) >> 8;
      uVar34 = (ushort)(uStack_10ea * uStack_10fa + uStack_110a * uStack_111a +
                       uStack_112a * uStack_113a) >> 8;
      uStack_ab6 = (ushort)bStack_1add;
      uStack_ab4 = (ushort)bStack_1fc7;
      uStack_ab2 = (ushort)bStack_1fc1;
      uStack_aae = (ushort)bStack_1fe5;
      uStack_aac = (ushort)bStack_1b1f;
      uStack_aaa = (ushort)bStack_1b19;
      uStack_ad6 = (ushort)bStack_1adf;
      uStack_ad4 = (ushort)bStack_1ad9;
      uStack_ad2 = (ushort)bStack_1fc3;
      uStack_ace = (ushort)bStack_1fe7;
      uStack_acc = (ushort)bStack_1fe1;
      uStack_aca = (ushort)bStack_1b1b;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_1166 = (ushort)bVar1;
      uStack_1164 = (ushort)bVar1;
      uStack_1162 = (ushort)bVar1;
      uStack_115e = (ushort)bVar1;
      uStack_115c = (ushort)bVar1;
      uStack_115a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_1666 = (ushort)bVar2;
      uStack_1664 = (ushort)bVar2;
      uStack_1662 = (ushort)bVar2;
      uStack_165e = (ushort)bVar2;
      uStack_165c = (ushort)bVar2;
      uStack_165a = (ushort)bVar2;
      uVar26 = ((ushort)(uVar37 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1666 = ((ushort)(uVar40 * uStack_1166) >> 7) + uStack_1666;
      uStack_1664 = ((ushort)(uVar45 * uStack_1164) >> 7) + uStack_1664;
      uStack_1662 = ((ushort)(uVar48 * uStack_1162) >> 7) + uStack_1662;
      uVar30 = ((ushort)(uVar51 * bVar1) >> 7) + (ushort)bVar2;
      uStack_165e = ((ushort)(uVar54 * uStack_115e) >> 7) + uStack_165e;
      uStack_165c = ((ushort)(uVar57 * uStack_115c) >> 7) + uStack_165c;
      uStack_165a = ((ushort)(uVar60 * uStack_115a) >> 7) + uStack_165a;
      bVar1 = RGB2YUV[uVar24].y_factor;
      uStack_1186 = (ushort)bVar1;
      uStack_1184 = (ushort)bVar1;
      uStack_1182 = (ushort)bVar1;
      uStack_117e = (ushort)bVar1;
      uStack_117c = (ushort)bVar1;
      uStack_117a = (ushort)bVar1;
      bVar2 = RGB2YUV[uVar24].y_offset;
      uStack_1686 = (ushort)bVar2;
      uStack_1684 = (ushort)bVar2;
      uStack_1682 = (ushort)bVar2;
      uStack_167e = (ushort)bVar2;
      uStack_167c = (ushort)bVar2;
      uStack_167a = (ushort)bVar2;
      uVar27 = ((ushort)(uVar25 * bVar1) >> 7) + (ushort)bVar2;
      uStack_1686 = ((ushort)(uVar28 * uStack_1186) >> 7) + uStack_1686;
      uStack_1684 = ((ushort)(uVar43 * uStack_1184) >> 7) + uStack_1684;
      uStack_1682 = ((ushort)(uVar44 * uStack_1182) >> 7) + uStack_1682;
      uVar31 = ((ushort)(uVar29 * bVar1) >> 7) + (ushort)bVar2;
      uStack_167e = ((ushort)(uVar32 * uStack_117e) >> 7) + uStack_167e;
      uStack_167c = ((ushort)(uVar33 * uStack_117c) >> 7) + uStack_167c;
      uStack_167a = ((ushort)(uVar34 * uStack_117a) >> 7) + uStack_167a;
      *(ulong *)(u_ptr + 0x10) =
           CONCAT17((uStack_1682 != 0) * (uStack_1682 < 0x100) * (char)uStack_1682 -
                    (0xff < uStack_1682),
                    CONCAT16((uStack_1662 != 0) * (uStack_1662 < 0x100) * (char)uStack_1662 -
                             (0xff < uStack_1662),
                             CONCAT15((uStack_1684 != 0) * (uStack_1684 < 0x100) * (char)uStack_1684
                                      - (0xff < uStack_1684),
                                      CONCAT14((uStack_1664 != 0) * (uStack_1664 < 0x100) *
                                               (char)uStack_1664 - (0xff < uStack_1664),
                                               CONCAT13((uStack_1686 != 0) * (uStack_1686 < 0x100) *
                                                        (char)uStack_1686 - (0xff < uStack_1686),
                                                        CONCAT12((uStack_1666 != 0) *
                                                                 (uStack_1666 < 0x100) *
                                                                 (char)uStack_1666 -
                                                                 (0xff < uStack_1666),
                                                                 CONCAT11((uVar27 != 0) *
                                                                          (uVar27 < 0x100) *
                                                                          (char)uVar27 -
                                                                          (0xff < uVar27),
                                                                          (uVar26 != 0) *
                                                                          (uVar26 < 0x100) *
                                                                          (char)uVar26 -
                                                                          (0xff < uVar26))))))));
      *(ulong *)(u_ptr + 0x18) =
           CONCAT17((uStack_167a != 0) * (uStack_167a < 0x100) * (char)uStack_167a -
                    (0xff < uStack_167a),
                    CONCAT16((uStack_165a != 0) * (uStack_165a < 0x100) * (char)uStack_165a -
                             (0xff < uStack_165a),
                             CONCAT15((uStack_167c != 0) * (uStack_167c < 0x100) * (char)uStack_167c
                                      - (0xff < uStack_167c),
                                      CONCAT14((uStack_165c != 0) * (uStack_165c < 0x100) *
                                               (char)uStack_165c - (0xff < uStack_165c),
                                               CONCAT13((uStack_167e != 0) * (uStack_167e < 0x100) *
                                                        (char)uStack_167e - (0xff < uStack_167e),
                                                        CONCAT12((uStack_165e != 0) *
                                                                 (uStack_165e < 0x100) *
                                                                 (char)uStack_165e -
                                                                 (0xff < uStack_165e),
                                                                 CONCAT11((uVar31 != 0) *
                                                                          (uVar31 < 0x100) *
                                                                          (char)uVar31 -
                                                                          (0xff < uVar31),
                                                                          (uVar30 != 0) *
                                                                          (uVar30 < 0x100) *
                                                                          (char)uVar30 -
                                                                          (0xff < uVar30))))))));
      auVar18._2_2_ =
           (uStack_9f6 - uVar38) + (uStack_a36 - uVar39) + (uStack_a76 - uVar40) +
           (uStack_ab6 - uVar28);
      auVar18._0_2_ =
           (bStack_1f96 - uVar35) + (bStack_1f93 - uVar36) + (bStack_1fa6 - uVar37) +
           (bStack_1fa3 - uVar25);
      auVar18._4_2_ =
           (uStack_9f4 - uVar41) + (uStack_a34 - uVar42) + (uStack_a74 - uVar45) +
           (uStack_ab4 - uVar43);
      auVar18._6_2_ =
           (uStack_9f2 - uVar46) + (uStack_a32 - uVar47) + (uStack_a72 - uVar48) +
           (uStack_ab2 - uVar44);
      auVar18._10_2_ =
           (uStack_9ee - uVar52) + (uStack_a2e - uVar53) + (uStack_a6e - uVar54) +
           (uStack_aae - uVar32);
      auVar18._8_2_ =
           (bStack_1aee - uVar49) + (bStack_1aeb - uVar50) + (bStack_1afe - uVar51) +
           (bStack_1afb - uVar29);
      auVar18._12_2_ =
           (uStack_9ec - uVar55) + (uStack_a2c - uVar56) + (uStack_a6c - uVar57) +
           (uStack_aac - uVar33);
      auVar18._14_2_ =
           (uStack_9ea - uVar58) + (uStack_a2a - uVar59) + (uStack_a6a - uVar60) +
           (uStack_aaa - uVar34);
      auVar61 = psraw(auVar18,ZEXT416(2));
      bVar1 = RGB2YUV[uVar24].cb_factor;
      local_1198 = auVar61._0_2_;
      sStack_1196 = auVar61._2_2_;
      sStack_1194 = auVar61._4_2_;
      sStack_1192 = auVar61._6_2_;
      sStack_1190 = auVar61._8_2_;
      sStack_118e = auVar61._10_2_;
      sStack_118c = auVar61._12_2_;
      sStack_118a = auVar61._14_2_;
      uStack_11a6 = (ushort)bVar1;
      uStack_11a4 = (ushort)bVar1;
      uStack_11a2 = (ushort)bVar1;
      uStack_119e = (ushort)bVar1;
      uStack_119c = (ushort)bVar1;
      uStack_119a = (ushort)bVar1;
      auVar17._2_2_ = sStack_1196 * uStack_11a6;
      auVar17._0_2_ = local_1198 * (ushort)bVar1;
      auVar17._4_2_ = sStack_1194 * uStack_11a4;
      auVar17._6_2_ = sStack_1192 * uStack_11a2;
      auVar17._8_2_ = sStack_1190 * (ushort)bVar1;
      auVar17._10_2_ = sStack_118e * uStack_119e;
      auVar17._12_2_ = sStack_118c * uStack_119c;
      auVar17._14_2_ = sStack_118a * uStack_119a;
      auVar61 = psraw(auVar17,ZEXT416(8));
      local_1698 = auVar61._0_2_;
      sStack_1696 = auVar61._2_2_;
      sStack_1694 = auVar61._4_2_;
      sStack_1692 = auVar61._6_2_;
      sStack_1690 = auVar61._8_2_;
      sStack_168e = auVar61._10_2_;
      sStack_168c = auVar61._12_2_;
      sStack_168a = auVar61._14_2_;
      local_1698 = local_1698 + 0x80;
      sStack_1696 = sStack_1696 + 0x80;
      sStack_1694 = sStack_1694 + 0x80;
      sStack_1692 = sStack_1692 + 0x80;
      sStack_1690 = sStack_1690 + 0x80;
      sStack_168e = sStack_168e + 0x80;
      sStack_168c = sStack_168c + 0x80;
      sStack_168a = sStack_168a + 0x80;
      auVar16._2_2_ =
           (uStack_a16 - uVar38) + (uStack_a56 - uVar39) + (uStack_a96 - uVar40) +
           (uStack_ad6 - uVar28);
      auVar16._0_2_ =
           (local_1f98 - uVar35) + (bStack_1f95 - uVar36) + (local_1fa8 - uVar37) +
           (bStack_1fa5 - uVar25);
      auVar16._4_2_ =
           (uStack_a14 - uVar41) + (uStack_a54 - uVar42) + (uStack_a94 - uVar45) +
           (uStack_ad4 - uVar43);
      auVar16._6_2_ =
           (uStack_a12 - uVar46) + (uStack_a52 - uVar47) + (uStack_a92 - uVar48) +
           (uStack_ad2 - uVar44);
      auVar16._10_2_ =
           (uStack_a0e - uVar52) + (uStack_a4e - uVar53) + (uStack_a8e - uVar54) +
           (uStack_ace - uVar32);
      auVar16._8_2_ =
           (bStack_1af0 - uVar49) + (bStack_1aed - uVar50) + (bStack_1b00 - uVar51) +
           (bStack_1afd - uVar29);
      auVar16._12_2_ =
           (uStack_a0c - uVar55) + (uStack_a4c - uVar56) + (uStack_a8c - uVar57) +
           (uStack_acc - uVar33);
      auVar16._14_2_ =
           (uStack_a0a - uVar58) + (uStack_a4a - uVar59) + (uStack_a8a - uVar60) +
           (uStack_aca - uVar34);
      auVar61 = psraw(auVar16,ZEXT416(2));
      bVar1 = RGB2YUV[uVar24].cr_factor;
      local_11b8 = auVar61._0_2_;
      sStack_11b6 = auVar61._2_2_;
      sStack_11b4 = auVar61._4_2_;
      sStack_11b2 = auVar61._6_2_;
      sStack_11b0 = auVar61._8_2_;
      sStack_11ae = auVar61._10_2_;
      sStack_11ac = auVar61._12_2_;
      sStack_11aa = auVar61._14_2_;
      uStack_11c6 = (ushort)bVar1;
      uStack_11c4 = (ushort)bVar1;
      uStack_11c2 = (ushort)bVar1;
      uStack_11be = (ushort)bVar1;
      uStack_11bc = (ushort)bVar1;
      uStack_11ba = (ushort)bVar1;
      auVar61._2_2_ = sStack_11b6 * uStack_11c6;
      auVar61._0_2_ = local_11b8 * (ushort)bVar1;
      auVar61._4_2_ = sStack_11b4 * uStack_11c4;
      auVar61._6_2_ = sStack_11b2 * uStack_11c2;
      auVar61._8_2_ = sStack_11b0 * (ushort)bVar1;
      auVar61._10_2_ = sStack_11ae * uStack_11be;
      auVar61._12_2_ = sStack_11ac * uStack_11bc;
      auVar61._14_2_ = sStack_11aa * uStack_11ba;
      auVar61 = psraw(auVar61,ZEXT416(8));
      local_16b8 = auVar61._0_2_;
      sStack_16b6 = auVar61._2_2_;
      sStack_16b4 = auVar61._4_2_;
      sStack_16b2 = auVar61._6_2_;
      sStack_16b0 = auVar61._8_2_;
      sStack_16ae = auVar61._10_2_;
      sStack_16ac = auVar61._12_2_;
      sStack_16aa = auVar61._14_2_;
      local_16b8 = local_16b8 + 0x80;
      sStack_16b6 = sStack_16b6 + 0x80;
      sStack_16b4 = sStack_16b4 + 0x80;
      sStack_16b2 = sStack_16b2 + 0x80;
      sStack_16b0 = sStack_16b0 + 0x80;
      sStack_16ae = sStack_16ae + 0x80;
      sStack_16ac = sStack_16ac + 0x80;
      sStack_16aa = sStack_16aa + 0x80;
      *(ulong *)v_ptr =
           CONCAT17((0 < sStack_140a) * (sStack_140a < 0x100) * (char)sStack_140a -
                    (0xff < sStack_140a),
                    CONCAT16((0 < sStack_140c) * (sStack_140c < 0x100) * (char)sStack_140c -
                             (0xff < sStack_140c),
                             CONCAT15((0 < sStack_140e) * (sStack_140e < 0x100) * (char)sStack_140e
                                      - (0xff < sStack_140e),
                                      CONCAT14((0 < sStack_1410) * (sStack_1410 < 0x100) *
                                               (char)sStack_1410 - (0xff < sStack_1410),
                                               CONCAT13((0 < sStack_1412) * (sStack_1412 < 0x100) *
                                                        (char)sStack_1412 - (0xff < sStack_1412),
                                                        CONCAT12((0 < sStack_1414) *
                                                                 (sStack_1414 < 0x100) *
                                                                 (char)sStack_1414 -
                                                                 (0xff < sStack_1414),
                                                                 CONCAT11((0 < sStack_1416) *
                                                                          (sStack_1416 < 0x100) *
                                                                          (char)sStack_1416 -
                                                                          (0xff < sStack_1416),
                                                                          (0 < local_1418) *
                                                                          (local_1418 < 0x100) *
                                                                          (char)local_1418 -
                                                                          (0xff < local_1418))))))))
      ;
      *(ulong *)(v_ptr + 8) =
           CONCAT17((0 < sStack_168a) * (sStack_168a < 0x100) * (char)sStack_168a -
                    (0xff < sStack_168a),
                    CONCAT16((0 < sStack_168c) * (sStack_168c < 0x100) * (char)sStack_168c -
                             (0xff < sStack_168c),
                             CONCAT15((0 < sStack_168e) * (sStack_168e < 0x100) * (char)sStack_168e
                                      - (0xff < sStack_168e),
                                      CONCAT14((0 < sStack_1690) * (sStack_1690 < 0x100) *
                                               (char)sStack_1690 - (0xff < sStack_1690),
                                               CONCAT13((0 < sStack_1692) * (sStack_1692 < 0x100) *
                                                        (char)sStack_1692 - (0xff < sStack_1692),
                                                        CONCAT12((0 < sStack_1694) *
                                                                 (sStack_1694 < 0x100) *
                                                                 (char)sStack_1694 -
                                                                 (0xff < sStack_1694),
                                                                 CONCAT11((0 < sStack_1696) *
                                                                          (sStack_1696 < 0x100) *
                                                                          (char)sStack_1696 -
                                                                          (0xff < sStack_1696),
                                                                          (0 < local_1698) *
                                                                          (local_1698 < 0x100) *
                                                                          (char)local_1698 -
                                                                          (0xff < local_1698))))))))
      ;
      *(ulong *)local_2230 =
           CONCAT17((0 < sStack_142a) * (sStack_142a < 0x100) * (char)sStack_142a -
                    (0xff < sStack_142a),
                    CONCAT16((0 < sStack_142c) * (sStack_142c < 0x100) * (char)sStack_142c -
                             (0xff < sStack_142c),
                             CONCAT15((0 < sStack_142e) * (sStack_142e < 0x100) * (char)sStack_142e
                                      - (0xff < sStack_142e),
                                      CONCAT14((0 < sStack_1430) * (sStack_1430 < 0x100) *
                                               (char)sStack_1430 - (0xff < sStack_1430),
                                               CONCAT13((0 < sStack_1432) * (sStack_1432 < 0x100) *
                                                        (char)sStack_1432 - (0xff < sStack_1432),
                                                        CONCAT12((0 < sStack_1434) *
                                                                 (sStack_1434 < 0x100) *
                                                                 (char)sStack_1434 -
                                                                 (0xff < sStack_1434),
                                                                 CONCAT11((0 < sStack_1436) *
                                                                          (sStack_1436 < 0x100) *
                                                                          (char)sStack_1436 -
                                                                          (0xff < sStack_1436),
                                                                          (0 < local_1438) *
                                                                          (local_1438 < 0x100) *
                                                                          (char)local_1438 -
                                                                          (0xff < local_1438))))))))
      ;
      *(ulong *)(local_2230 + 8) =
           CONCAT17((0 < sStack_16aa) * (sStack_16aa < 0x100) * (char)sStack_16aa -
                    (0xff < sStack_16aa),
                    CONCAT16((0 < sStack_16ac) * (sStack_16ac < 0x100) * (char)sStack_16ac -
                             (0xff < sStack_16ac),
                             CONCAT15((0 < sStack_16ae) * (sStack_16ae < 0x100) * (char)sStack_16ae
                                      - (0xff < sStack_16ae),
                                      CONCAT14((0 < sStack_16b0) * (sStack_16b0 < 0x100) *
                                               (char)sStack_16b0 - (0xff < sStack_16b0),
                                               CONCAT13((0 < sStack_16b2) * (sStack_16b2 < 0x100) *
                                                        (char)sStack_16b2 - (0xff < sStack_16b2),
                                                        CONCAT12((0 < sStack_16b4) *
                                                                 (sStack_16b4 < 0x100) *
                                                                 (char)sStack_16b4 -
                                                                 (0xff < sStack_16b4),
                                                                 CONCAT11((0 < sStack_16b6) *
                                                                          (sStack_16b6 < 0x100) *
                                                                          (char)sStack_16b6 -
                                                                          (0xff < sStack_16b6),
                                                                          (0 < local_16b8) *
                                                                          (local_16b8 < 0x100) *
                                                                          (char)local_16b8 -
                                                                          (0xff < local_16b8))))))))
      ;
      rgb_ptr2 = rgb_ptr2 + 0x60;
      y_ptr1 = y_ptr1 + 0x60;
      y_ptr2 = y_ptr2 + 0x20;
      u_ptr = u_ptr + 0x20;
      v_ptr = v_ptr + 0x10;
      local_2230 = local_2230 + 0x10;
    }
  }
  return;
}

Assistant:

void rgb24_yuv420_sseu(uint32_t width, uint32_t height, 
	const uint8_t *RGB, uint32_t RGB_stride, 
	uint8_t *Y, uint8_t *U, uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const RGB2YUVParam *const param = &(RGB2YUV[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			RGB2YUV_32
			
			rgb_ptr1+=96;
			rgb_ptr2+=96;
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}